

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

size_t ZSTD_compressBlock_lazy_extDict_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  ulong *iEnd;
  BYTE *iStart;
  undefined8 *puVar5;
  ulong *iLimit;
  char *pcVar6;
  char *pcVar7;
  uint uVar8;
  uint uVar9;
  BYTE *base_00;
  BYTE *pBVar10;
  U32 *pUVar11;
  U16 *pUVar12;
  ushort uVar13;
  undefined8 uVar14;
  long lVar15;
  U32 target;
  uint uVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  ulong *puVar20;
  size_t sVar21;
  ulong uVar22;
  ulong *puVar23;
  ulong uVar24;
  ulong *puVar25;
  BYTE *pBVar26;
  byte bVar27;
  byte bVar28;
  U32 UVar29;
  uint uVar30;
  ulong *puVar31;
  long lVar32;
  uint uVar33;
  BYTE *pBVar34;
  int iVar35;
  ulong *puVar36;
  seqDef *psVar37;
  BYTE *base;
  BYTE *pBVar38;
  ulong *puVar39;
  ulong uVar40;
  long lVar41;
  ulong uVar42;
  ulong uVar43;
  U32 *hashTable_3;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  BYTE *base_8;
  long lVar47;
  U32 UVar48;
  BYTE *base_6;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  BYTE *pStart;
  BYTE *pStart_6;
  BYTE *pInLoopLimit;
  U32 maxDistance;
  BYTE *litLimit_w;
  ulong local_1c8;
  BYTE *local_180;
  uint local_174;
  ulong *local_140;
  uint auStack_b8 [34];
  char cVar55;
  undefined1 uVar73;
  char cVar74;
  undefined1 uVar75;
  char cVar76;
  undefined1 uVar77;
  char cVar78;
  
  iEnd = (ulong *)((long)src + srcSize);
  iLimit = (ulong *)((long)src + (srcSize - 0x10));
  base_00 = (ms->window).base;
  pBVar10 = (ms->window).dictBase;
  uVar8 = (ms->window).dictLimit;
  iStart = base_00 + uVar8;
  uVar9 = (ms->window).lowLimit;
  puVar36 = (ulong *)((ulong)(iStart == (BYTE *)src) + (long)src);
  uVar16 = (ms->cParams).minMatch;
  UVar48 = 6;
  if (uVar16 < 6) {
    UVar48 = uVar16;
  }
  uVar16 = (ms->cParams).windowLog;
  uVar46 = *rep;
  local_174 = rep[1];
  ZSTD_row_fillHashCache
            (ms,base_00,5 - ((ms->cParams).searchLog < 5),UVar48,ms->nextToUpdate,(BYTE *)iLimit);
  local_140 = (ulong *)src;
  if (puVar36 < iLimit) {
    puVar20 = (ulong *)(pBVar10 + uVar8);
    uVar16 = 1 << ((byte)uVar16 & 0x1f);
    iVar17 = uVar8 - 1;
    puVar1 = (ulong *)((long)iEnd - 7);
    puVar2 = (ulong *)((long)iEnd - 3);
    puVar3 = (ulong *)((long)iEnd - 1);
    puVar4 = iEnd + -4;
    do {
      iVar35 = (int)puVar36 - (int)base_00;
      iVar18 = iVar35 + 1;
      uVar44 = (ms->window).lowLimit;
      UVar48 = ms->loadedDictEnd;
      uVar30 = iVar18 - uVar16;
      if (iVar18 - uVar44 <= uVar16) {
        uVar30 = uVar44;
      }
      if (UVar48 != 0) {
        uVar30 = uVar44;
      }
      uVar19 = iVar18 - uVar46;
      pBVar38 = base_00;
      if (uVar19 < uVar8) {
        pBVar38 = pBVar10;
      }
      if (iVar17 - uVar19 < 3) {
LAB_001fd3ce:
        local_180 = (BYTE *)0x0;
      }
      else {
        local_180 = (BYTE *)0x0;
        if (uVar46 < (iVar35 - uVar30) + 1) {
          if (*(int *)((long)puVar36 + 1U) != *(int *)(pBVar38 + uVar19)) goto LAB_001fd3ce;
          puVar31 = iEnd;
          if (uVar19 < uVar8) {
            puVar31 = puVar20;
          }
          sVar21 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar36 + 5),(BYTE *)((long)(pBVar38 + uVar19) + 4),
                              (BYTE *)iEnd,(BYTE *)puVar31,iStart);
          local_180 = (BYTE *)(sVar21 + 4);
        }
      }
      uVar30 = (ms->cParams).searchLog;
      uVar19 = (ms->cParams).minMatch;
      if (uVar30 < 5) {
        bVar27 = (byte)uVar30;
        if (uVar19 - 6 < 2) {
          pBVar38 = (ms->window).base;
          pBVar26 = (ms->window).dictBase;
          uVar22 = (long)puVar36 - (long)pBVar38;
          uVar33 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          uVar19 = (uint)uVar22;
          uVar30 = uVar19 - uVar33;
          if (uVar19 - uVar44 <= uVar33) {
            uVar30 = uVar44;
          }
          uVar33 = (ms->window).dictLimit;
          pUVar11 = ms->hashTable;
          pUVar12 = ms->tagTable;
          if (UVar48 != 0) {
            uVar30 = uVar44;
          }
          uVar42 = (ulong)ms->nextToUpdate;
          bVar28 = 0x38 - (char)ms->rowHashLog;
          if (ms->nextToUpdate < uVar19) {
            do {
              uVar45 = (uint)uVar42 & 7;
              uVar44 = ms->hashCache[uVar45];
              ms->hashCache[uVar45] =
                   (U32)((ulong)(*(long *)(pBVar38 + uVar42 + 8) * -0x30e4432340650000) >>
                        (bVar28 & 0x3f));
              uVar24 = (ulong)(uVar44 >> 4 & 0xfffffff0);
              uVar45 = (byte)((char)pUVar12[uVar24] - 1) & 0xf;
              *(char *)(pUVar12 + uVar24) = (char)uVar45;
              *(char *)((long)pUVar12 + (ulong)uVar45 + 1 + uVar24 * 2) = (char)uVar44;
              pUVar11[uVar24 + uVar45] = (uint)uVar42;
              uVar42 = uVar42 + 1;
            } while (uVar42 < (uVar22 & 0xffffffff));
          }
          ms->nextToUpdate = uVar19;
          uVar44 = ms->hashCache[uVar19 & 7];
          ms->hashCache[uVar19 & 7] =
               (U32)((ulong)(*(long *)(pBVar38 + (uVar22 & 0xffffffff) + 8) * -0x30e4432340650000)
                    >> (bVar28 & 0x3f));
          uVar22 = (ulong)(uVar44 >> 4 & 0xfffffff0);
          bVar28 = (byte)pUVar12[uVar22];
          pcVar6 = (char *)((long)pUVar12 + uVar22 * 2 + 1);
          uVar77 = (undefined1)(uVar44 >> 0x18);
          uVar75 = (undefined1)(uVar44 >> 0x10);
          uVar73 = (undefined1)(uVar44 >> 8);
          auVar57._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar77,uVar77),uVar75),CONCAT14(uVar75,uVar44)) >>
                    0x20);
          auVar57[3] = uVar73;
          auVar57[2] = uVar73;
          auVar57[0] = (undefined1)uVar44;
          auVar57[1] = auVar57[0];
          auVar57._8_8_ = 0;
          auVar80 = pshuflw(auVar57,auVar57,0);
          cVar55 = auVar80[0];
          auVar58[0] = -(cVar55 == *pcVar6);
          cVar74 = auVar80[1];
          auVar58[1] = -(cVar74 == pcVar6[1]);
          cVar76 = auVar80[2];
          auVar58[2] = -(cVar76 == pcVar6[2]);
          cVar78 = auVar80[3];
          auVar58[3] = -(cVar78 == pcVar6[3]);
          auVar58[4] = -(cVar55 == pcVar6[4]);
          auVar58[5] = -(cVar74 == pcVar6[5]);
          auVar58[6] = -(cVar76 == pcVar6[6]);
          auVar58[7] = -(cVar78 == pcVar6[7]);
          auVar58[8] = -(cVar55 == pcVar6[8]);
          auVar58[9] = -(cVar74 == pcVar6[9]);
          auVar58[10] = -(cVar76 == pcVar6[10]);
          auVar58[0xb] = -(cVar78 == pcVar6[0xb]);
          auVar58[0xc] = -(cVar55 == pcVar6[0xc]);
          auVar58[0xd] = -(cVar74 == pcVar6[0xd]);
          auVar58[0xe] = -(cVar76 == pcVar6[0xe]);
          auVar58[0xf] = -(cVar78 == pcVar6[0xf]);
          uVar13 = (ushort)(SUB161(auVar58 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar58 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar58 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar58 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar58 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar58 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar58 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar58 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar58 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar58 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar58 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar58 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar58 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar58 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar58 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar58[0xf] >> 7) << 0xf;
          uVar44 = (uint)uVar13;
          if ((bVar28 & 0xf) != 0) {
            uVar44 = (uint)uVar13 << (0x10 - (bVar28 & 0xf) & 0x1f) & 0xfffe |
                     (uint)(uVar13 >> (bVar28 & 0xf));
          }
          if (uVar44 == 0) {
            lVar41 = 0;
          }
          else {
            lVar47 = 0;
            while( true ) {
              iVar18 = 0;
              if (uVar44 != 0) {
                for (; (uVar44 >> iVar18 & 1) == 0; iVar18 = iVar18 + 1) {
                }
              }
              lVar41 = lVar47;
              if (pUVar11[uVar22 + (iVar18 + (uint)bVar28 & 0xf)] < uVar30) break;
              lVar41 = lVar47 + 1;
              auStack_b8[lVar47] = pUVar11[uVar22 + (iVar18 + (uint)bVar28 & 0xf)];
              uVar44 = uVar44 & uVar44 - 1;
              if ((uVar44 == 0) ||
                 (iVar18 = (int)lVar47, lVar47 = lVar41, (int)(1L << (bVar27 & 0x3f)) + -1 == iVar18
                 )) break;
            }
          }
          uVar44 = bVar28 - 1 & 0xf;
          *(char *)(pUVar12 + uVar22) = (char)uVar44;
          *(undefined1 *)((long)(pUVar12 + uVar22) + (ulong)uVar44 + 1) = auVar57[0];
          UVar48 = ms->nextToUpdate;
          ms->nextToUpdate = UVar48 + 1;
          pUVar11[uVar22 + uVar44] = UVar48;
          if (lVar41 == 0) goto LAB_001fe9f3;
          local_1c8 = 999999999;
          lVar47 = 0;
          uVar22 = 3;
          do {
            uVar44 = auStack_b8[lVar47];
            uVar42 = (ulong)uVar44;
            if (uVar44 < uVar33) {
              if (*(int *)(pBVar26 + uVar42) == (int)*puVar36) {
                sVar21 = ZSTD_count_2segments
                                   ((BYTE *)((long)puVar36 + 4),pBVar26 + uVar42 + 4,(BYTE *)iEnd,
                                    pBVar26 + uVar33,pBVar38 + uVar33);
                uVar42 = sVar21 + 4;
LAB_001fe245:
                if ((uVar22 < uVar42) &&
                   (local_1c8 = (ulong)((uVar19 + 2) - uVar44), uVar22 = uVar42,
                   (ulong *)((long)puVar36 + uVar42) == iEnd)) break;
              }
            }
            else {
              puVar31 = (ulong *)(pBVar38 + uVar42);
              if (*(BYTE *)(uVar22 + (long)puVar31) == *(BYTE *)((long)puVar36 + uVar22)) {
                puVar23 = puVar36;
                if (puVar36 < puVar1) {
                  if (*puVar31 == *puVar36) {
                    lVar32 = 0;
                    do {
                      puVar23 = (ulong *)((long)puVar36 + lVar32 + 8);
                      if (puVar1 <= puVar23) {
                        puVar31 = (ulong *)(pBVar38 + lVar32 + uVar42 + 8);
                        goto LAB_001fe202;
                      }
                      lVar15 = lVar32 + uVar42 + 8;
                      lVar32 = lVar32 + 8;
                    } while (*(ulong *)(pBVar38 + lVar15) == *puVar23);
                    uVar24 = *puVar23 ^ *(ulong *)(pBVar38 + lVar15);
                    uVar42 = 0;
                    if (uVar24 != 0) {
                      for (; (uVar24 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                      }
                    }
                    uVar42 = (uVar42 >> 3 & 0x1fffffff) + lVar32;
                  }
                  else {
                    uVar24 = *puVar36 ^ *puVar31;
                    uVar42 = 0;
                    if (uVar24 != 0) {
                      for (; (uVar24 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                      }
                    }
                    uVar42 = uVar42 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_001fe202:
                  if ((puVar23 < puVar2) && ((int)*puVar31 == (int)*puVar23)) {
                    puVar23 = (ulong *)((long)puVar23 + 4);
                    puVar31 = (ulong *)((long)puVar31 + 4);
                  }
                  if ((puVar23 < puVar3) && ((short)*puVar31 == (short)*puVar23)) {
                    puVar23 = (ulong *)((long)puVar23 + 2);
                    puVar31 = (ulong *)((long)puVar31 + 2);
                  }
                  if (puVar23 < iEnd) {
                    puVar23 = (ulong *)((long)puVar23 + (ulong)((BYTE)*puVar31 == (BYTE)*puVar23));
                  }
                  uVar42 = (long)puVar23 - (long)puVar36;
                }
                goto LAB_001fe245;
              }
            }
            uVar42 = uVar22;
            lVar47 = lVar47 + 1;
            uVar22 = uVar42;
          } while (lVar47 != lVar41);
        }
        else if (uVar19 == 5) {
          pBVar38 = (ms->window).base;
          pBVar26 = (ms->window).dictBase;
          uVar22 = (long)puVar36 - (long)pBVar38;
          uVar33 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          uVar19 = (uint)uVar22;
          uVar30 = uVar19 - uVar33;
          if (uVar19 - uVar44 <= uVar33) {
            uVar30 = uVar44;
          }
          uVar33 = (ms->window).dictLimit;
          pUVar11 = ms->hashTable;
          pUVar12 = ms->tagTable;
          if (UVar48 != 0) {
            uVar30 = uVar44;
          }
          uVar42 = (ulong)ms->nextToUpdate;
          bVar28 = 0x38 - (char)ms->rowHashLog;
          if (ms->nextToUpdate < uVar19) {
            do {
              uVar45 = (uint)uVar42 & 7;
              uVar44 = ms->hashCache[uVar45];
              ms->hashCache[uVar45] =
                   (U32)((ulong)(*(long *)(pBVar38 + uVar42 + 8) * -0x30e4432345000000) >>
                        (bVar28 & 0x3f));
              uVar24 = (ulong)(uVar44 >> 4 & 0xfffffff0);
              uVar45 = (byte)((char)pUVar12[uVar24] - 1) & 0xf;
              *(char *)(pUVar12 + uVar24) = (char)uVar45;
              *(char *)((long)pUVar12 + (ulong)uVar45 + 1 + uVar24 * 2) = (char)uVar44;
              pUVar11[uVar24 + uVar45] = (uint)uVar42;
              uVar42 = uVar42 + 1;
            } while (uVar42 < (uVar22 & 0xffffffff));
          }
          ms->nextToUpdate = uVar19;
          uVar44 = ms->hashCache[uVar19 & 7];
          ms->hashCache[uVar19 & 7] =
               (U32)((ulong)(*(long *)(pBVar38 + (uVar22 & 0xffffffff) + 8) * -0x30e4432345000000)
                    >> (bVar28 & 0x3f));
          uVar22 = (ulong)(uVar44 >> 4 & 0xfffffff0);
          bVar28 = (byte)pUVar12[uVar22];
          pcVar6 = (char *)((long)pUVar12 + uVar22 * 2 + 1);
          uVar77 = (undefined1)(uVar44 >> 0x18);
          uVar75 = (undefined1)(uVar44 >> 0x10);
          uVar73 = (undefined1)(uVar44 >> 8);
          auVar62._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar77,uVar77),uVar75),CONCAT14(uVar75,uVar44)) >>
                    0x20);
          auVar62[3] = uVar73;
          auVar62[2] = uVar73;
          auVar62[0] = (undefined1)uVar44;
          auVar62[1] = auVar62[0];
          auVar62._8_8_ = 0;
          auVar80 = pshuflw(auVar62,auVar62,0);
          cVar55 = auVar80[0];
          auVar60[0] = -(cVar55 == *pcVar6);
          cVar74 = auVar80[1];
          auVar60[1] = -(cVar74 == pcVar6[1]);
          cVar76 = auVar80[2];
          auVar60[2] = -(cVar76 == pcVar6[2]);
          cVar78 = auVar80[3];
          auVar60[3] = -(cVar78 == pcVar6[3]);
          auVar60[4] = -(cVar55 == pcVar6[4]);
          auVar60[5] = -(cVar74 == pcVar6[5]);
          auVar60[6] = -(cVar76 == pcVar6[6]);
          auVar60[7] = -(cVar78 == pcVar6[7]);
          auVar60[8] = -(cVar55 == pcVar6[8]);
          auVar60[9] = -(cVar74 == pcVar6[9]);
          auVar60[10] = -(cVar76 == pcVar6[10]);
          auVar60[0xb] = -(cVar78 == pcVar6[0xb]);
          auVar60[0xc] = -(cVar55 == pcVar6[0xc]);
          auVar60[0xd] = -(cVar74 == pcVar6[0xd]);
          auVar60[0xe] = -(cVar76 == pcVar6[0xe]);
          auVar60[0xf] = -(cVar78 == pcVar6[0xf]);
          uVar13 = (ushort)(SUB161(auVar60 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar60 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar60 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar60 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar60 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar60 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar60 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar60 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar60 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar60 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar60 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar60 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar60 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar60 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar60 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar60[0xf] >> 7) << 0xf;
          uVar44 = (uint)uVar13;
          if ((bVar28 & 0xf) != 0) {
            uVar44 = (uint)uVar13 << (0x10 - (bVar28 & 0xf) & 0x1f) & 0xfffe |
                     (uint)(uVar13 >> (bVar28 & 0xf));
          }
          if (uVar44 == 0) {
            lVar41 = 0;
          }
          else {
            lVar47 = 0;
            while( true ) {
              iVar18 = 0;
              if (uVar44 != 0) {
                for (; (uVar44 >> iVar18 & 1) == 0; iVar18 = iVar18 + 1) {
                }
              }
              lVar41 = lVar47;
              if (pUVar11[uVar22 + (iVar18 + (uint)bVar28 & 0xf)] < uVar30) break;
              lVar41 = lVar47 + 1;
              auStack_b8[lVar47] = pUVar11[uVar22 + (iVar18 + (uint)bVar28 & 0xf)];
              uVar44 = uVar44 & uVar44 - 1;
              if ((uVar44 == 0) ||
                 (iVar18 = (int)lVar47, lVar47 = lVar41, (1 << (bVar27 & 0x1f)) + -1 == iVar18))
              break;
            }
          }
          uVar44 = bVar28 - 1 & 0xf;
          *(char *)(pUVar12 + uVar22) = (char)uVar44;
          *(undefined1 *)((long)(pUVar12 + uVar22) + (ulong)uVar44 + 1) = auVar62[0];
          UVar48 = ms->nextToUpdate;
          ms->nextToUpdate = UVar48 + 1;
          pUVar11[uVar22 + uVar44] = UVar48;
          if (lVar41 == 0) goto LAB_001fe9f3;
          local_1c8 = 999999999;
          lVar47 = 0;
          uVar22 = 3;
          do {
            uVar44 = auStack_b8[lVar47];
            uVar42 = (ulong)uVar44;
            if (uVar44 < uVar33) {
              if (*(int *)(pBVar26 + uVar42) == (int)*puVar36) {
                sVar21 = ZSTD_count_2segments
                                   ((BYTE *)((long)puVar36 + 4),pBVar26 + uVar42 + 4,(BYTE *)iEnd,
                                    pBVar26 + uVar33,pBVar38 + uVar33);
                uVar42 = sVar21 + 4;
LAB_001fe61a:
                if ((uVar22 < uVar42) &&
                   (local_1c8 = (ulong)((uVar19 + 2) - uVar44), uVar22 = uVar42,
                   (ulong *)((long)puVar36 + uVar42) == iEnd)) break;
              }
            }
            else {
              puVar31 = (ulong *)(pBVar38 + uVar42);
              if (*(BYTE *)(uVar22 + (long)puVar31) == *(BYTE *)((long)puVar36 + uVar22)) {
                puVar23 = puVar36;
                if (puVar36 < puVar1) {
                  if (*puVar31 == *puVar36) {
                    lVar32 = 0;
                    do {
                      puVar23 = (ulong *)((long)puVar36 + lVar32 + 8);
                      if (puVar1 <= puVar23) {
                        puVar31 = (ulong *)(pBVar38 + lVar32 + uVar42 + 8);
                        goto LAB_001fe5d7;
                      }
                      lVar15 = lVar32 + uVar42 + 8;
                      lVar32 = lVar32 + 8;
                    } while (*(ulong *)(pBVar38 + lVar15) == *puVar23);
                    uVar24 = *puVar23 ^ *(ulong *)(pBVar38 + lVar15);
                    uVar42 = 0;
                    if (uVar24 != 0) {
                      for (; (uVar24 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                      }
                    }
                    uVar42 = (uVar42 >> 3 & 0x1fffffff) + lVar32;
                  }
                  else {
                    uVar24 = *puVar36 ^ *puVar31;
                    uVar42 = 0;
                    if (uVar24 != 0) {
                      for (; (uVar24 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                      }
                    }
                    uVar42 = uVar42 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_001fe5d7:
                  if ((puVar23 < puVar2) && ((int)*puVar31 == (int)*puVar23)) {
                    puVar23 = (ulong *)((long)puVar23 + 4);
                    puVar31 = (ulong *)((long)puVar31 + 4);
                  }
                  if ((puVar23 < puVar3) && ((short)*puVar31 == (short)*puVar23)) {
                    puVar23 = (ulong *)((long)puVar23 + 2);
                    puVar31 = (ulong *)((long)puVar31 + 2);
                  }
                  if (puVar23 < iEnd) {
                    puVar23 = (ulong *)((long)puVar23 + (ulong)((BYTE)*puVar31 == (BYTE)*puVar23));
                  }
                  uVar42 = (long)puVar23 - (long)puVar36;
                }
                goto LAB_001fe61a;
              }
            }
            uVar42 = uVar22;
            lVar47 = lVar47 + 1;
            uVar22 = uVar42;
          } while (lVar47 != lVar41);
        }
        else {
          pBVar38 = (ms->window).base;
          pBVar26 = (ms->window).dictBase;
          uVar22 = (long)puVar36 - (long)pBVar38;
          uVar33 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          uVar19 = (uint)uVar22;
          uVar30 = uVar19 - uVar33;
          if (uVar19 - uVar44 <= uVar33) {
            uVar30 = uVar44;
          }
          uVar33 = (ms->window).dictLimit;
          pUVar11 = ms->hashTable;
          pUVar12 = ms->tagTable;
          if (UVar48 != 0) {
            uVar30 = uVar44;
          }
          uVar42 = (ulong)ms->nextToUpdate;
          bVar28 = 0x18 - (char)ms->rowHashLog;
          if (ms->nextToUpdate < uVar19) {
            do {
              uVar45 = (uint)uVar42 & 7;
              uVar44 = ms->hashCache[uVar45];
              ms->hashCache[uVar45] =
                   (uint)(*(int *)(pBVar38 + uVar42 + 8) * -0x61c8864f) >> (bVar28 & 0x1f);
              uVar24 = (ulong)(uVar44 >> 4 & 0xfffffff0);
              uVar45 = (byte)((char)pUVar12[uVar24] - 1) & 0xf;
              *(char *)(pUVar12 + uVar24) = (char)uVar45;
              *(char *)((long)pUVar12 + (ulong)uVar45 + 1 + uVar24 * 2) = (char)uVar44;
              pUVar11[uVar24 + uVar45] = (uint)uVar42;
              uVar42 = uVar42 + 1;
            } while (uVar42 < (uVar22 & 0xffffffff));
          }
          ms->nextToUpdate = uVar19;
          uVar44 = ms->hashCache[uVar19 & 7];
          ms->hashCache[uVar19 & 7] =
               (uint)(*(int *)(pBVar38 + (uVar22 & 0xffffffff) + 8) * -0x61c8864f) >>
               (bVar28 & 0x1f);
          uVar22 = (ulong)(uVar44 >> 4 & 0xfffffff0);
          bVar28 = (byte)pUVar12[uVar22];
          pcVar6 = (char *)((long)pUVar12 + uVar22 * 2 + 1);
          uVar77 = (undefined1)(uVar44 >> 0x18);
          uVar75 = (undefined1)(uVar44 >> 0x10);
          uVar73 = (undefined1)(uVar44 >> 8);
          auVar80._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar77,uVar77),uVar75),CONCAT14(uVar75,uVar44)) >>
                    0x20);
          auVar80[3] = uVar73;
          auVar80[2] = uVar73;
          auVar80[0] = (undefined1)uVar44;
          auVar80[1] = auVar80[0];
          auVar80._8_8_ = 0;
          auVar62 = pshuflw(auVar80,auVar80,0);
          cVar55 = auVar62[0];
          auVar63[0] = -(cVar55 == *pcVar6);
          cVar74 = auVar62[1];
          auVar63[1] = -(cVar74 == pcVar6[1]);
          cVar76 = auVar62[2];
          auVar63[2] = -(cVar76 == pcVar6[2]);
          cVar78 = auVar62[3];
          auVar63[3] = -(cVar78 == pcVar6[3]);
          auVar63[4] = -(cVar55 == pcVar6[4]);
          auVar63[5] = -(cVar74 == pcVar6[5]);
          auVar63[6] = -(cVar76 == pcVar6[6]);
          auVar63[7] = -(cVar78 == pcVar6[7]);
          auVar63[8] = -(cVar55 == pcVar6[8]);
          auVar63[9] = -(cVar74 == pcVar6[9]);
          auVar63[10] = -(cVar76 == pcVar6[10]);
          auVar63[0xb] = -(cVar78 == pcVar6[0xb]);
          auVar63[0xc] = -(cVar55 == pcVar6[0xc]);
          auVar63[0xd] = -(cVar74 == pcVar6[0xd]);
          auVar63[0xe] = -(cVar76 == pcVar6[0xe]);
          auVar63[0xf] = -(cVar78 == pcVar6[0xf]);
          uVar13 = (ushort)(SUB161(auVar63 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar63 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar63 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar63 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar63 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar63 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar63 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar63 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar63 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar63 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar63 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar63 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar63 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar63 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar63 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar63[0xf] >> 7) << 0xf;
          uVar44 = (uint)uVar13;
          if ((bVar28 & 0xf) != 0) {
            uVar44 = (uint)uVar13 << (0x10 - (bVar28 & 0xf) & 0x1f) & 0xfffe |
                     (uint)(uVar13 >> (bVar28 & 0xf));
          }
          if (uVar44 == 0) {
            lVar41 = 0;
          }
          else {
            lVar47 = 0;
            while( true ) {
              iVar18 = 0;
              if (uVar44 != 0) {
                for (; (uVar44 >> iVar18 & 1) == 0; iVar18 = iVar18 + 1) {
                }
              }
              lVar41 = lVar47;
              if (pUVar11[uVar22 + (iVar18 + (uint)bVar28 & 0xf)] < uVar30) break;
              lVar41 = lVar47 + 1;
              auStack_b8[lVar47] = pUVar11[uVar22 + (iVar18 + (uint)bVar28 & 0xf)];
              uVar44 = uVar44 & uVar44 - 1;
              if ((uVar44 == 0) ||
                 (iVar18 = (int)lVar47, lVar47 = lVar41, (int)(1L << (bVar27 & 0x3f)) + -1 == iVar18
                 )) break;
            }
          }
          uVar44 = bVar28 - 1 & 0xf;
          *(char *)(pUVar12 + uVar22) = (char)uVar44;
          *(undefined1 *)((long)(pUVar12 + uVar22) + (ulong)uVar44 + 1) = auVar80[0];
          UVar48 = ms->nextToUpdate;
          ms->nextToUpdate = UVar48 + 1;
          pUVar11[uVar22 + uVar44] = UVar48;
          if (lVar41 == 0) goto LAB_001fe9f3;
          local_1c8 = 999999999;
          lVar47 = 0;
          uVar22 = 3;
          do {
            uVar44 = auStack_b8[lVar47];
            uVar42 = (ulong)uVar44;
            if (uVar44 < uVar33) {
              if (*(int *)(pBVar26 + uVar42) == (int)*puVar36) {
                sVar21 = ZSTD_count_2segments
                                   ((BYTE *)((long)puVar36 + 4),pBVar26 + uVar42 + 4,(BYTE *)iEnd,
                                    pBVar26 + uVar33,pBVar38 + uVar33);
                uVar42 = sVar21 + 4;
LAB_001fe9c5:
                if ((uVar22 < uVar42) &&
                   (local_1c8 = (ulong)((uVar19 + 2) - uVar44), uVar22 = uVar42,
                   (ulong *)((long)puVar36 + uVar42) == iEnd)) break;
              }
            }
            else {
              puVar31 = (ulong *)(pBVar38 + uVar42);
              if (*(BYTE *)(uVar22 + (long)puVar31) == *(BYTE *)((long)puVar36 + uVar22)) {
                puVar23 = puVar36;
                if (puVar36 < puVar1) {
                  if (*puVar31 == *puVar36) {
                    lVar32 = 0;
                    do {
                      puVar23 = (ulong *)((long)puVar36 + lVar32 + 8);
                      if (puVar1 <= puVar23) {
                        puVar31 = (ulong *)(pBVar38 + lVar32 + uVar42 + 8);
                        goto LAB_001fe982;
                      }
                      lVar15 = lVar32 + uVar42 + 8;
                      lVar32 = lVar32 + 8;
                    } while (*(ulong *)(pBVar38 + lVar15) == *puVar23);
                    uVar24 = *puVar23 ^ *(ulong *)(pBVar38 + lVar15);
                    uVar42 = 0;
                    if (uVar24 != 0) {
                      for (; (uVar24 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                      }
                    }
                    uVar42 = (uVar42 >> 3 & 0x1fffffff) + lVar32;
                  }
                  else {
                    uVar24 = *puVar36 ^ *puVar31;
                    uVar42 = 0;
                    if (uVar24 != 0) {
                      for (; (uVar24 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                      }
                    }
                    uVar42 = uVar42 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_001fe982:
                  if ((puVar23 < puVar2) && ((int)*puVar31 == (int)*puVar23)) {
                    puVar23 = (ulong *)((long)puVar23 + 4);
                    puVar31 = (ulong *)((long)puVar31 + 4);
                  }
                  if ((puVar23 < puVar3) && ((short)*puVar31 == (short)*puVar23)) {
                    puVar23 = (ulong *)((long)puVar23 + 2);
                    puVar31 = (ulong *)((long)puVar31 + 2);
                  }
                  if (puVar23 < iEnd) {
                    puVar23 = (ulong *)((long)puVar23 + (ulong)((BYTE)*puVar31 == (BYTE)*puVar23));
                  }
                  uVar42 = (long)puVar23 - (long)puVar36;
                }
                goto LAB_001fe9c5;
              }
            }
            uVar42 = uVar22;
            lVar47 = lVar47 + 1;
            uVar22 = uVar42;
          } while (lVar47 != lVar41);
        }
      }
      else if (uVar19 - 6 < 2) {
        pBVar38 = (ms->window).base;
        uVar22 = (long)puVar36 - (long)pBVar38;
        uVar33 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar19 = (uint)uVar22;
        uVar30 = uVar19 - uVar33;
        if (uVar19 - uVar44 <= uVar33) {
          uVar30 = uVar44;
        }
        pBVar26 = (ms->window).dictBase;
        uVar33 = (ms->window).dictLimit;
        pUVar11 = ms->hashTable;
        pUVar12 = ms->tagTable;
        if (UVar48 != 0) {
          uVar30 = uVar44;
        }
        uVar42 = (ulong)ms->nextToUpdate;
        bVar27 = 0x38 - (char)ms->rowHashLog;
        if (ms->nextToUpdate < uVar19) {
          do {
            uVar45 = (uint)uVar42 & 7;
            uVar44 = ms->hashCache[uVar45];
            ms->hashCache[uVar45] =
                 (U32)((ulong)(*(long *)(pBVar38 + uVar42 + 8) * -0x30e4432340650000) >>
                      (bVar27 & 0x3f));
            uVar24 = (ulong)(uVar44 >> 3 & 0xffffffe0);
            uVar45 = (byte)((char)pUVar12[uVar24] - 1) & 0x1f;
            *(char *)(pUVar12 + uVar24) = (char)uVar45;
            *(char *)((long)pUVar12 + (ulong)uVar45 + 1 + uVar24 * 2) = (char)uVar44;
            pUVar11[uVar24 + uVar45] = (uint)uVar42;
            uVar42 = uVar42 + 1;
          } while (uVar42 < (uVar22 & 0xffffffff));
        }
        ms->nextToUpdate = uVar19;
        uVar44 = ms->hashCache[uVar19 & 7];
        ms->hashCache[uVar19 & 7] =
             (U32)((ulong)(*(long *)(pBVar38 + (uVar22 & 0xffffffff) + 8) * -0x30e4432340650000) >>
                  (bVar27 & 0x3f));
        uVar22 = (ulong)(uVar44 >> 3 & 0xffffffe0);
        bVar27 = (byte)pUVar12[uVar22];
        pcVar6 = (char *)((long)pUVar12 + uVar22 * 2 + 1);
        pcVar7 = (char *)((long)pUVar12 + uVar22 * 2 + 0x11);
        uVar77 = (undefined1)(uVar44 >> 0x18);
        uVar75 = (undefined1)(uVar44 >> 0x10);
        uVar73 = (undefined1)(uVar44 >> 8);
        auVar79._4_4_ =
             (int)(CONCAT35(CONCAT21(CONCAT11(uVar77,uVar77),uVar75),CONCAT14(uVar75,uVar44)) >>
                  0x20);
        auVar79[3] = uVar73;
        auVar79[2] = uVar73;
        auVar79[0] = (undefined1)uVar44;
        auVar79[1] = auVar79[0];
        auVar79._8_8_ = 0;
        auVar80 = pshuflw(auVar79,auVar79,0);
        cVar55 = auVar80[0];
        auVar49[0] = -(*pcVar6 == cVar55);
        cVar74 = auVar80[1];
        auVar49[1] = -(pcVar6[1] == cVar74);
        cVar76 = auVar80[2];
        auVar49[2] = -(pcVar6[2] == cVar76);
        cVar78 = auVar80[3];
        auVar49[3] = -(pcVar6[3] == cVar78);
        auVar49[4] = -(pcVar6[4] == cVar55);
        auVar49[5] = -(pcVar6[5] == cVar74);
        auVar49[6] = -(pcVar6[6] == cVar76);
        auVar49[7] = -(pcVar6[7] == cVar78);
        auVar49[8] = -(pcVar6[8] == cVar55);
        auVar49[9] = -(pcVar6[9] == cVar74);
        auVar49[10] = -(pcVar6[10] == cVar76);
        auVar49[0xb] = -(pcVar6[0xb] == cVar78);
        auVar49[0xc] = -(pcVar6[0xc] == cVar55);
        auVar49[0xd] = -(pcVar6[0xd] == cVar74);
        auVar49[0xe] = -(pcVar6[0xe] == cVar76);
        auVar49[0xf] = -(pcVar6[0xf] == cVar78);
        auVar56[0] = -(*pcVar7 == cVar55);
        auVar56[1] = -(pcVar7[1] == cVar74);
        auVar56[2] = -(pcVar7[2] == cVar76);
        auVar56[3] = -(pcVar7[3] == cVar78);
        auVar56[4] = -(pcVar7[4] == cVar55);
        auVar56[5] = -(pcVar7[5] == cVar74);
        auVar56[6] = -(pcVar7[6] == cVar76);
        auVar56[7] = -(pcVar7[7] == cVar78);
        auVar56[8] = -(pcVar7[8] == cVar55);
        auVar56[9] = -(pcVar7[9] == cVar74);
        auVar56[10] = -(pcVar7[10] == cVar76);
        auVar56[0xb] = -(pcVar7[0xb] == cVar78);
        auVar56[0xc] = -(pcVar7[0xc] == cVar55);
        auVar56[0xd] = -(pcVar7[0xd] == cVar74);
        auVar56[0xe] = -(pcVar7[0xe] == cVar76);
        auVar56[0xf] = -(pcVar7[0xf] == cVar78);
        uVar45 = CONCAT22((ushort)(SUB161(auVar56 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar56 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar56 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar56 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar56 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar56 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar56 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar56 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar56 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar56 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar56 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar56 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar56 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar56 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar56 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar56[0xf] >> 7) << 0xf,
                          (ushort)(SUB161(auVar49 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar49 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar49 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar49 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar49 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar49 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar49 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar49 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar49 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar49 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar49 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar49 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar49 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar49 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar49 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar49[0xf] >> 7) << 0xf);
        uVar44 = uVar45 >> (bVar27 & 0x1f) | uVar45 << 0x20 - (bVar27 & 0x1f);
        if ((bVar27 & 0x1f) == 0) {
          uVar44 = uVar45;
        }
        if (uVar44 == 0) {
          lVar41 = 0;
        }
        else {
          lVar47 = 0;
          while( true ) {
            iVar18 = 0;
            if (uVar44 != 0) {
              for (; (uVar44 >> iVar18 & 1) == 0; iVar18 = iVar18 + 1) {
              }
            }
            lVar41 = lVar47;
            if (pUVar11[uVar22 + (iVar18 + (uint)bVar27 & 0x1f)] < uVar30) break;
            lVar41 = lVar47 + 1;
            auStack_b8[lVar47] = pUVar11[uVar22 + (iVar18 + (uint)bVar27 & 0x1f)];
            uVar44 = uVar44 & uVar44 - 1;
            if ((uVar44 == 0) || (iVar18 = (int)lVar47, lVar47 = lVar41, iVar18 == 0x1f)) break;
          }
        }
        uVar44 = bVar27 - 1 & 0x1f;
        *(char *)(pUVar12 + uVar22) = (char)uVar44;
        *(undefined1 *)((long)(pUVar12 + uVar22) + (ulong)uVar44 + 1) = auVar79[0];
        UVar48 = ms->nextToUpdate;
        ms->nextToUpdate = UVar48 + 1;
        pUVar11[uVar22 + uVar44] = UVar48;
        if (lVar41 == 0) goto LAB_001fe9f3;
        local_1c8 = 999999999;
        lVar47 = 0;
        uVar22 = 3;
        do {
          uVar44 = auStack_b8[lVar47];
          uVar42 = (ulong)uVar44;
          if (uVar44 < uVar33) {
            if (*(int *)(pBVar26 + uVar42) == (int)*puVar36) {
              sVar21 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar36 + 4),pBVar26 + uVar42 + 4,(BYTE *)iEnd,
                                  pBVar26 + uVar33,pBVar38 + uVar33);
              uVar42 = sVar21 + 4;
LAB_001fe070:
              if ((uVar22 < uVar42) &&
                 (local_1c8 = (ulong)((uVar19 + 2) - uVar44), uVar22 = uVar42,
                 (ulong *)((long)puVar36 + uVar42) == iEnd)) break;
            }
          }
          else {
            puVar31 = (ulong *)(pBVar38 + uVar42);
            if (*(BYTE *)(uVar22 + (long)puVar31) == *(BYTE *)((long)puVar36 + uVar22)) {
              puVar23 = puVar36;
              if (puVar36 < puVar1) {
                if (*puVar31 == *puVar36) {
                  lVar32 = 0;
                  do {
                    puVar23 = (ulong *)((long)puVar36 + lVar32 + 8);
                    if (puVar1 <= puVar23) {
                      puVar31 = (ulong *)(pBVar38 + lVar32 + uVar42 + 8);
                      goto LAB_001fe02d;
                    }
                    lVar15 = lVar32 + uVar42 + 8;
                    lVar32 = lVar32 + 8;
                  } while (*(ulong *)(pBVar38 + lVar15) == *puVar23);
                  uVar24 = *puVar23 ^ *(ulong *)(pBVar38 + lVar15);
                  uVar42 = 0;
                  if (uVar24 != 0) {
                    for (; (uVar24 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                    }
                  }
                  uVar42 = (uVar42 >> 3 & 0x1fffffff) + lVar32;
                }
                else {
                  uVar24 = *puVar36 ^ *puVar31;
                  uVar42 = 0;
                  if (uVar24 != 0) {
                    for (; (uVar24 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                    }
                  }
                  uVar42 = uVar42 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_001fe02d:
                if ((puVar23 < puVar2) && ((int)*puVar31 == (int)*puVar23)) {
                  puVar23 = (ulong *)((long)puVar23 + 4);
                  puVar31 = (ulong *)((long)puVar31 + 4);
                }
                if ((puVar23 < puVar3) && ((short)*puVar31 == (short)*puVar23)) {
                  puVar23 = (ulong *)((long)puVar23 + 2);
                  puVar31 = (ulong *)((long)puVar31 + 2);
                }
                if (puVar23 < iEnd) {
                  puVar23 = (ulong *)((long)puVar23 + (ulong)((BYTE)*puVar31 == (BYTE)*puVar23));
                }
                uVar42 = (long)puVar23 - (long)puVar36;
              }
              goto LAB_001fe070;
            }
          }
          uVar42 = uVar22;
          lVar47 = lVar47 + 1;
          uVar22 = uVar42;
        } while (lVar47 != lVar41);
      }
      else if (uVar19 == 5) {
        pBVar38 = (ms->window).base;
        uVar22 = (long)puVar36 - (long)pBVar38;
        uVar33 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar19 = (uint)uVar22;
        uVar30 = uVar19 - uVar33;
        if (uVar19 - uVar44 <= uVar33) {
          uVar30 = uVar44;
        }
        pBVar26 = (ms->window).dictBase;
        uVar33 = (ms->window).dictLimit;
        pUVar11 = ms->hashTable;
        pUVar12 = ms->tagTable;
        if (UVar48 != 0) {
          uVar30 = uVar44;
        }
        uVar42 = (ulong)ms->nextToUpdate;
        bVar27 = 0x38 - (char)ms->rowHashLog;
        if (ms->nextToUpdate < uVar19) {
          do {
            uVar45 = (uint)uVar42 & 7;
            uVar44 = ms->hashCache[uVar45];
            ms->hashCache[uVar45] =
                 (U32)((ulong)(*(long *)(pBVar38 + uVar42 + 8) * -0x30e4432345000000) >>
                      (bVar27 & 0x3f));
            uVar24 = (ulong)(uVar44 >> 3 & 0xffffffe0);
            uVar45 = (byte)((char)pUVar12[uVar24] - 1) & 0x1f;
            *(char *)(pUVar12 + uVar24) = (char)uVar45;
            *(char *)((long)pUVar12 + (ulong)uVar45 + 1 + uVar24 * 2) = (char)uVar44;
            pUVar11[uVar24 + uVar45] = (uint)uVar42;
            uVar42 = uVar42 + 1;
          } while (uVar42 < (uVar22 & 0xffffffff));
        }
        ms->nextToUpdate = uVar19;
        uVar44 = ms->hashCache[uVar19 & 7];
        ms->hashCache[uVar19 & 7] =
             (U32)((ulong)(*(long *)(pBVar38 + (uVar22 & 0xffffffff) + 8) * -0x30e4432345000000) >>
                  (bVar27 & 0x3f));
        uVar22 = (ulong)(uVar44 >> 3 & 0xffffffe0);
        bVar27 = (byte)pUVar12[uVar22];
        pcVar6 = (char *)((long)pUVar12 + uVar22 * 2 + 1);
        pcVar7 = (char *)((long)pUVar12 + uVar22 * 2 + 0x11);
        uVar77 = (undefined1)(uVar44 >> 0x18);
        uVar75 = (undefined1)(uVar44 >> 0x10);
        uVar73 = (undefined1)(uVar44 >> 8);
        auVar81._4_4_ =
             (int)(CONCAT35(CONCAT21(CONCAT11(uVar77,uVar77),uVar75),CONCAT14(uVar75,uVar44)) >>
                  0x20);
        auVar81[3] = uVar73;
        auVar81[2] = uVar73;
        auVar81[0] = (undefined1)uVar44;
        auVar81[1] = auVar81[0];
        auVar81._8_8_ = 0;
        auVar80 = pshuflw(auVar81,auVar81,0);
        cVar55 = auVar80[0];
        auVar50[0] = -(*pcVar6 == cVar55);
        cVar74 = auVar80[1];
        auVar50[1] = -(pcVar6[1] == cVar74);
        cVar76 = auVar80[2];
        auVar50[2] = -(pcVar6[2] == cVar76);
        cVar78 = auVar80[3];
        auVar50[3] = -(pcVar6[3] == cVar78);
        auVar50[4] = -(pcVar6[4] == cVar55);
        auVar50[5] = -(pcVar6[5] == cVar74);
        auVar50[6] = -(pcVar6[6] == cVar76);
        auVar50[7] = -(pcVar6[7] == cVar78);
        auVar50[8] = -(pcVar6[8] == cVar55);
        auVar50[9] = -(pcVar6[9] == cVar74);
        auVar50[10] = -(pcVar6[10] == cVar76);
        auVar50[0xb] = -(pcVar6[0xb] == cVar78);
        auVar50[0xc] = -(pcVar6[0xc] == cVar55);
        auVar50[0xd] = -(pcVar6[0xd] == cVar74);
        auVar50[0xe] = -(pcVar6[0xe] == cVar76);
        auVar50[0xf] = -(pcVar6[0xf] == cVar78);
        auVar59[0] = -(*pcVar7 == cVar55);
        auVar59[1] = -(pcVar7[1] == cVar74);
        auVar59[2] = -(pcVar7[2] == cVar76);
        auVar59[3] = -(pcVar7[3] == cVar78);
        auVar59[4] = -(pcVar7[4] == cVar55);
        auVar59[5] = -(pcVar7[5] == cVar74);
        auVar59[6] = -(pcVar7[6] == cVar76);
        auVar59[7] = -(pcVar7[7] == cVar78);
        auVar59[8] = -(pcVar7[8] == cVar55);
        auVar59[9] = -(pcVar7[9] == cVar74);
        auVar59[10] = -(pcVar7[10] == cVar76);
        auVar59[0xb] = -(pcVar7[0xb] == cVar78);
        auVar59[0xc] = -(pcVar7[0xc] == cVar55);
        auVar59[0xd] = -(pcVar7[0xd] == cVar74);
        auVar59[0xe] = -(pcVar7[0xe] == cVar76);
        auVar59[0xf] = -(pcVar7[0xf] == cVar78);
        uVar45 = CONCAT22((ushort)(SUB161(auVar59 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar59 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar59 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar59 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar59 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar59 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar59 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar59 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar59 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar59 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar59 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar59 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar59 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar59 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar59 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar59[0xf] >> 7) << 0xf,
                          (ushort)(SUB161(auVar50 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar50 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar50 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar50 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar50 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar50 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar50 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar50 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar50 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar50 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar50 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar50 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar50 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar50 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar50 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar50[0xf] >> 7) << 0xf);
        uVar44 = uVar45 >> (bVar27 & 0x1f) | uVar45 << 0x20 - (bVar27 & 0x1f);
        if ((bVar27 & 0x1f) == 0) {
          uVar44 = uVar45;
        }
        if (uVar44 == 0) {
          lVar41 = 0;
        }
        else {
          lVar47 = 0;
          while( true ) {
            iVar18 = 0;
            if (uVar44 != 0) {
              for (; (uVar44 >> iVar18 & 1) == 0; iVar18 = iVar18 + 1) {
              }
            }
            lVar41 = lVar47;
            if (pUVar11[uVar22 + (iVar18 + (uint)bVar27 & 0x1f)] < uVar30) break;
            lVar41 = lVar47 + 1;
            auStack_b8[lVar47] = pUVar11[uVar22 + (iVar18 + (uint)bVar27 & 0x1f)];
            uVar44 = uVar44 & uVar44 - 1;
            if ((uVar44 == 0) || (iVar18 = (int)lVar47, lVar47 = lVar41, iVar18 == 0x1f)) break;
          }
        }
        uVar44 = bVar27 - 1 & 0x1f;
        *(char *)(pUVar12 + uVar22) = (char)uVar44;
        *(undefined1 *)((long)(pUVar12 + uVar22) + (ulong)uVar44 + 1) = auVar81[0];
        UVar48 = ms->nextToUpdate;
        ms->nextToUpdate = UVar48 + 1;
        pUVar11[uVar22 + uVar44] = UVar48;
        if (lVar41 == 0) {
LAB_001fe9f3:
          uVar42 = 3;
          local_1c8 = 999999999;
        }
        else {
          local_1c8 = 999999999;
          lVar47 = 0;
          uVar22 = 3;
          do {
            uVar44 = auStack_b8[lVar47];
            uVar42 = (ulong)uVar44;
            if (uVar44 < uVar33) {
              if (*(int *)(pBVar26 + uVar42) == (int)*puVar36) {
                sVar21 = ZSTD_count_2segments
                                   ((BYTE *)((long)puVar36 + 4),pBVar26 + uVar42 + 4,(BYTE *)iEnd,
                                    pBVar26 + uVar33,pBVar38 + uVar33);
                uVar42 = sVar21 + 4;
LAB_001fe43f:
                if ((uVar22 < uVar42) &&
                   (local_1c8 = (ulong)((uVar19 + 2) - uVar44), uVar22 = uVar42,
                   (ulong *)((long)puVar36 + uVar42) == iEnd)) break;
              }
            }
            else {
              puVar31 = (ulong *)(pBVar38 + uVar42);
              if (*(BYTE *)(uVar22 + (long)puVar31) == *(BYTE *)((long)puVar36 + uVar22)) {
                puVar23 = puVar36;
                if (puVar36 < puVar1) {
                  if (*puVar31 == *puVar36) {
                    lVar32 = 0;
                    do {
                      puVar23 = (ulong *)((long)puVar36 + lVar32 + 8);
                      if (puVar1 <= puVar23) {
                        puVar31 = (ulong *)(pBVar38 + lVar32 + uVar42 + 8);
                        goto LAB_001fe3fc;
                      }
                      lVar15 = lVar32 + uVar42 + 8;
                      lVar32 = lVar32 + 8;
                    } while (*(ulong *)(pBVar38 + lVar15) == *puVar23);
                    uVar24 = *puVar23 ^ *(ulong *)(pBVar38 + lVar15);
                    uVar42 = 0;
                    if (uVar24 != 0) {
                      for (; (uVar24 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                      }
                    }
                    uVar42 = (uVar42 >> 3 & 0x1fffffff) + lVar32;
                  }
                  else {
                    uVar24 = *puVar36 ^ *puVar31;
                    uVar42 = 0;
                    if (uVar24 != 0) {
                      for (; (uVar24 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                      }
                    }
                    uVar42 = uVar42 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_001fe3fc:
                  if ((puVar23 < puVar2) && ((int)*puVar31 == (int)*puVar23)) {
                    puVar23 = (ulong *)((long)puVar23 + 4);
                    puVar31 = (ulong *)((long)puVar31 + 4);
                  }
                  if ((puVar23 < puVar3) && ((short)*puVar31 == (short)*puVar23)) {
                    puVar23 = (ulong *)((long)puVar23 + 2);
                    puVar31 = (ulong *)((long)puVar31 + 2);
                  }
                  if (puVar23 < iEnd) {
                    puVar23 = (ulong *)((long)puVar23 + (ulong)((BYTE)*puVar31 == (BYTE)*puVar23));
                  }
                  uVar42 = (long)puVar23 - (long)puVar36;
                }
                goto LAB_001fe43f;
              }
            }
            uVar42 = uVar22;
            lVar47 = lVar47 + 1;
            uVar22 = uVar42;
          } while (lVar47 != lVar41);
        }
      }
      else {
        pBVar38 = (ms->window).base;
        uVar22 = (long)puVar36 - (long)pBVar38;
        uVar33 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar19 = (uint)uVar22;
        uVar30 = uVar19 - uVar33;
        if (uVar19 - uVar44 <= uVar33) {
          uVar30 = uVar44;
        }
        pBVar26 = (ms->window).dictBase;
        uVar33 = (ms->window).dictLimit;
        pUVar11 = ms->hashTable;
        pUVar12 = ms->tagTable;
        if (UVar48 != 0) {
          uVar30 = uVar44;
        }
        uVar42 = (ulong)ms->nextToUpdate;
        bVar27 = 0x18 - (char)ms->rowHashLog;
        if (ms->nextToUpdate < uVar19) {
          do {
            uVar45 = (uint)uVar42 & 7;
            uVar44 = ms->hashCache[uVar45];
            ms->hashCache[uVar45] =
                 (uint)(*(int *)(pBVar38 + uVar42 + 8) * -0x61c8864f) >> (bVar27 & 0x1f);
            uVar24 = (ulong)(uVar44 >> 3 & 0xffffffe0);
            uVar45 = (byte)((char)pUVar12[uVar24] - 1) & 0x1f;
            *(char *)(pUVar12 + uVar24) = (char)uVar45;
            *(char *)((long)pUVar12 + (ulong)uVar45 + 1 + uVar24 * 2) = (char)uVar44;
            pUVar11[uVar24 + uVar45] = (uint)uVar42;
            uVar42 = uVar42 + 1;
          } while (uVar42 < (uVar22 & 0xffffffff));
        }
        ms->nextToUpdate = uVar19;
        uVar44 = ms->hashCache[uVar19 & 7];
        ms->hashCache[uVar19 & 7] =
             (uint)(*(int *)(pBVar38 + (uVar22 & 0xffffffff) + 8) * -0x61c8864f) >> (bVar27 & 0x1f);
        uVar22 = (ulong)(uVar44 >> 3 & 0xffffffe0);
        bVar27 = (byte)pUVar12[uVar22];
        pcVar6 = (char *)((long)pUVar12 + uVar22 * 2 + 1);
        pcVar7 = (char *)((long)pUVar12 + uVar22 * 2 + 0x11);
        uVar77 = (undefined1)(uVar44 >> 0x18);
        uVar75 = (undefined1)(uVar44 >> 0x10);
        uVar73 = (undefined1)(uVar44 >> 8);
        auVar82._4_4_ =
             (int)(CONCAT35(CONCAT21(CONCAT11(uVar77,uVar77),uVar75),CONCAT14(uVar75,uVar44)) >>
                  0x20);
        auVar82[3] = uVar73;
        auVar82[2] = uVar73;
        auVar82[0] = (undefined1)uVar44;
        auVar82[1] = auVar82[0];
        auVar82._8_8_ = 0;
        auVar80 = pshuflw(auVar82,auVar82,0);
        cVar55 = auVar80[0];
        auVar51[0] = -(*pcVar6 == cVar55);
        cVar74 = auVar80[1];
        auVar51[1] = -(pcVar6[1] == cVar74);
        cVar76 = auVar80[2];
        auVar51[2] = -(pcVar6[2] == cVar76);
        cVar78 = auVar80[3];
        auVar51[3] = -(pcVar6[3] == cVar78);
        auVar51[4] = -(pcVar6[4] == cVar55);
        auVar51[5] = -(pcVar6[5] == cVar74);
        auVar51[6] = -(pcVar6[6] == cVar76);
        auVar51[7] = -(pcVar6[7] == cVar78);
        auVar51[8] = -(pcVar6[8] == cVar55);
        auVar51[9] = -(pcVar6[9] == cVar74);
        auVar51[10] = -(pcVar6[10] == cVar76);
        auVar51[0xb] = -(pcVar6[0xb] == cVar78);
        auVar51[0xc] = -(pcVar6[0xc] == cVar55);
        auVar51[0xd] = -(pcVar6[0xd] == cVar74);
        auVar51[0xe] = -(pcVar6[0xe] == cVar76);
        auVar51[0xf] = -(pcVar6[0xf] == cVar78);
        auVar61[0] = -(*pcVar7 == cVar55);
        auVar61[1] = -(pcVar7[1] == cVar74);
        auVar61[2] = -(pcVar7[2] == cVar76);
        auVar61[3] = -(pcVar7[3] == cVar78);
        auVar61[4] = -(pcVar7[4] == cVar55);
        auVar61[5] = -(pcVar7[5] == cVar74);
        auVar61[6] = -(pcVar7[6] == cVar76);
        auVar61[7] = -(pcVar7[7] == cVar78);
        auVar61[8] = -(pcVar7[8] == cVar55);
        auVar61[9] = -(pcVar7[9] == cVar74);
        auVar61[10] = -(pcVar7[10] == cVar76);
        auVar61[0xb] = -(pcVar7[0xb] == cVar78);
        auVar61[0xc] = -(pcVar7[0xc] == cVar55);
        auVar61[0xd] = -(pcVar7[0xd] == cVar74);
        auVar61[0xe] = -(pcVar7[0xe] == cVar76);
        auVar61[0xf] = -(pcVar7[0xf] == cVar78);
        uVar45 = CONCAT22((ushort)(SUB161(auVar61 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar61 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar61 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar61 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar61 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar61 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar61 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar61 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar61 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar61 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar61 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar61 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar61 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar61 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar61 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar61[0xf] >> 7) << 0xf,
                          (ushort)(SUB161(auVar51 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar51 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar51 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar51 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar51 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar51 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar51 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar51 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar51 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar51 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar51 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar51 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar51 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar51 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar51 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar51[0xf] >> 7) << 0xf);
        uVar44 = uVar45 >> (bVar27 & 0x1f) | uVar45 << 0x20 - (bVar27 & 0x1f);
        if ((bVar27 & 0x1f) == 0) {
          uVar44 = uVar45;
        }
        if (uVar44 == 0) {
          lVar41 = 0;
        }
        else {
          lVar47 = 0;
          while( true ) {
            iVar18 = 0;
            if (uVar44 != 0) {
              for (; (uVar44 >> iVar18 & 1) == 0; iVar18 = iVar18 + 1) {
              }
            }
            lVar41 = lVar47;
            if (pUVar11[uVar22 + (iVar18 + (uint)bVar27 & 0x1f)] < uVar30) break;
            lVar41 = lVar47 + 1;
            auStack_b8[lVar47] = pUVar11[uVar22 + (iVar18 + (uint)bVar27 & 0x1f)];
            uVar44 = uVar44 & uVar44 - 1;
            if ((uVar44 == 0) || (iVar18 = (int)lVar47, lVar47 = lVar41, iVar18 == 0x1f)) break;
          }
        }
        uVar44 = bVar27 - 1 & 0x1f;
        *(char *)(pUVar12 + uVar22) = (char)uVar44;
        *(undefined1 *)((long)(pUVar12 + uVar22) + (ulong)uVar44 + 1) = auVar82[0];
        UVar48 = ms->nextToUpdate;
        ms->nextToUpdate = UVar48 + 1;
        pUVar11[uVar22 + uVar44] = UVar48;
        if (lVar41 == 0) goto LAB_001fe9f3;
        local_1c8 = 999999999;
        lVar47 = 0;
        uVar22 = 3;
        do {
          uVar44 = auStack_b8[lVar47];
          uVar42 = (ulong)uVar44;
          if (uVar44 < uVar33) {
            if (*(int *)(pBVar26 + uVar42) == (int)*puVar36) {
              sVar21 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar36 + 4),pBVar26 + uVar42 + 4,(BYTE *)iEnd,
                                  pBVar26 + uVar33,pBVar38 + uVar33);
              uVar42 = sVar21 + 4;
LAB_001fe7f3:
              if ((uVar22 < uVar42) &&
                 (local_1c8 = (ulong)((uVar19 + 2) - uVar44), uVar22 = uVar42,
                 (ulong *)((long)puVar36 + uVar42) == iEnd)) break;
            }
          }
          else {
            puVar31 = (ulong *)(pBVar38 + uVar42);
            if (*(BYTE *)(uVar22 + (long)puVar31) == *(BYTE *)((long)puVar36 + uVar22)) {
              puVar23 = puVar36;
              if (puVar36 < puVar1) {
                if (*puVar31 == *puVar36) {
                  lVar32 = 0;
                  do {
                    puVar23 = (ulong *)((long)puVar36 + lVar32 + 8);
                    if (puVar1 <= puVar23) {
                      puVar31 = (ulong *)(pBVar38 + lVar32 + uVar42 + 8);
                      goto LAB_001fe7b0;
                    }
                    lVar15 = lVar32 + uVar42 + 8;
                    lVar32 = lVar32 + 8;
                  } while (*(ulong *)(pBVar38 + lVar15) == *puVar23);
                  uVar24 = *puVar23 ^ *(ulong *)(pBVar38 + lVar15);
                  uVar42 = 0;
                  if (uVar24 != 0) {
                    for (; (uVar24 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                    }
                  }
                  uVar42 = (uVar42 >> 3 & 0x1fffffff) + lVar32;
                }
                else {
                  uVar24 = *puVar36 ^ *puVar31;
                  uVar42 = 0;
                  if (uVar24 != 0) {
                    for (; (uVar24 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                    }
                  }
                  uVar42 = uVar42 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_001fe7b0:
                if ((puVar23 < puVar2) && ((int)*puVar31 == (int)*puVar23)) {
                  puVar23 = (ulong *)((long)puVar23 + 4);
                  puVar31 = (ulong *)((long)puVar31 + 4);
                }
                if ((puVar23 < puVar3) && ((short)*puVar31 == (short)*puVar23)) {
                  puVar23 = (ulong *)((long)puVar23 + 2);
                  puVar31 = (ulong *)((long)puVar31 + 2);
                }
                if (puVar23 < iEnd) {
                  puVar23 = (ulong *)((long)puVar23 + (ulong)((BYTE)*puVar31 == (BYTE)*puVar23));
                }
                uVar42 = (long)puVar23 - (long)puVar36;
              }
              goto LAB_001fe7f3;
            }
          }
          uVar42 = uVar22;
          lVar47 = lVar47 + 1;
          uVar22 = uVar42;
        } while (lVar47 != lVar41);
      }
      pBVar38 = local_180;
      if (local_180 < uVar42) {
        pBVar38 = (BYTE *)uVar42;
      }
      if (pBVar38 < 4) {
        puVar36 = (ulong *)((long)puVar36 + ((long)puVar36 - (long)local_140 >> 8) + 1);
      }
      else {
        puVar31 = puVar36;
        if (uVar42 <= local_180) {
          local_1c8 = 0;
          puVar31 = (ulong *)((long)puVar36 + 1U);
        }
        local_180 = (BYTE *)((long)puVar36 + 9);
        do {
          puVar23 = puVar31;
          uVar22 = (ulong)pBVar38;
          uVar42 = local_1c8;
          if (iLimit <= puVar36) break;
          puVar31 = (ulong *)((long)puVar36 + 1);
          iVar35 = iVar35 + 1;
          if (local_1c8 == 0) {
            uVar42 = 0;
          }
          else {
            UVar48 = (ms->window).lowLimit;
            UVar29 = iVar35 - uVar16;
            if (iVar35 - UVar48 <= uVar16) {
              UVar29 = UVar48;
            }
            if (ms->loadedDictEnd != 0) {
              UVar29 = UVar48;
            }
            uVar44 = iVar35 - uVar46;
            pBVar38 = base_00;
            if (uVar44 < uVar8) {
              pBVar38 = pBVar10;
            }
            if (((2 < iVar17 - uVar44) && (uVar46 < iVar35 - UVar29)) &&
               (*(int *)puVar31 == *(int *)(pBVar38 + uVar44))) {
              puVar25 = iEnd;
              if (uVar44 < uVar8) {
                puVar25 = puVar20;
              }
              sVar21 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar36 + 5),(BYTE *)((long)(pBVar38 + uVar44) + 4)
                                  ,(BYTE *)iEnd,(BYTE *)puVar25,iStart);
              if (sVar21 < 0xfffffffffffffffc) {
                uVar30 = (int)local_1c8 + 1;
                uVar44 = 0x1f;
                if (uVar30 != 0) {
                  for (; uVar30 >> uVar44 == 0; uVar44 = uVar44 - 1) {
                  }
                }
                if ((int)((uVar44 ^ 0x1f) + (int)uVar22 * 3 + -0x1e) < (int)(sVar21 + 4) * 3) {
                  uVar22 = sVar21 + 4;
                  puVar23 = puVar31;
                  uVar42 = 0;
                }
              }
            }
          }
          uVar44 = (ms->cParams).searchLog;
          uVar30 = (ms->cParams).minMatch;
          if (uVar44 < 5) {
            bVar27 = (byte)uVar44;
            if (uVar30 - 6 < 2) {
              pUVar11 = ms->hashTable;
              pUVar12 = ms->tagTable;
              pBVar26 = (ms->window).base;
              uVar24 = (long)puVar31 - (long)pBVar26;
              uVar33 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
              uVar44 = (ms->window).lowLimit;
              uVar19 = (uint)uVar24;
              uVar30 = uVar19 - uVar33;
              if (uVar19 - uVar44 <= uVar33) {
                uVar30 = uVar44;
              }
              pBVar34 = (ms->window).dictBase;
              uVar33 = (ms->window).dictLimit;
              if (ms->loadedDictEnd != 0) {
                uVar30 = uVar44;
              }
              uVar43 = (ulong)ms->nextToUpdate;
              bVar28 = 0x38 - (char)ms->rowHashLog;
              if (ms->nextToUpdate < uVar19) {
                do {
                  uVar45 = (uint)uVar43 & 7;
                  uVar44 = ms->hashCache[uVar45];
                  ms->hashCache[uVar45] =
                       (U32)((ulong)(*(long *)(pBVar26 + uVar43 + 8) * -0x30e4432340650000) >>
                            (bVar28 & 0x3f));
                  uVar40 = (ulong)(uVar44 >> 4 & 0xfffffff0);
                  uVar45 = (byte)((char)pUVar12[uVar40] - 1) & 0xf;
                  *(char *)(pUVar12 + uVar40) = (char)uVar45;
                  *(char *)((long)pUVar12 + (ulong)uVar45 + 1 + uVar40 * 2) = (char)uVar44;
                  pUVar11[uVar40 + uVar45] = (uint)uVar43;
                  uVar43 = uVar43 + 1;
                } while (uVar43 < (uVar24 & 0xffffffff));
              }
              ms->nextToUpdate = uVar19;
              uVar44 = ms->hashCache[uVar19 & 7];
              ms->hashCache[uVar19 & 7] =
                   (U32)((ulong)(*(long *)(pBVar26 + (uVar24 & 0xffffffff) + 8) *
                                -0x30e4432340650000) >> (bVar28 & 0x3f));
              uVar24 = (ulong)(uVar44 >> 4 & 0xfffffff0);
              bVar28 = (byte)pUVar12[uVar24];
              pcVar6 = (char *)((long)pUVar12 + uVar24 * 2 + 1);
              uVar77 = (undefined1)(uVar44 >> 0x18);
              uVar75 = (undefined1)(uVar44 >> 0x10);
              uVar73 = (undefined1)(uVar44 >> 8);
              auVar65._4_4_ =
                   (int)(CONCAT35(CONCAT21(CONCAT11(uVar77,uVar77),uVar75),CONCAT14(uVar75,uVar44))
                        >> 0x20);
              auVar65[3] = uVar73;
              auVar65[2] = uVar73;
              auVar65[0] = (undefined1)uVar44;
              auVar65[1] = auVar65[0];
              auVar65._8_8_ = 0;
              auVar80 = pshuflw(auVar65,auVar65,0);
              cVar55 = auVar80[0];
              auVar66[0] = -(cVar55 == *pcVar6);
              cVar74 = auVar80[1];
              auVar66[1] = -(cVar74 == pcVar6[1]);
              cVar76 = auVar80[2];
              auVar66[2] = -(cVar76 == pcVar6[2]);
              cVar78 = auVar80[3];
              auVar66[3] = -(cVar78 == pcVar6[3]);
              auVar66[4] = -(cVar55 == pcVar6[4]);
              auVar66[5] = -(cVar74 == pcVar6[5]);
              auVar66[6] = -(cVar76 == pcVar6[6]);
              auVar66[7] = -(cVar78 == pcVar6[7]);
              auVar66[8] = -(cVar55 == pcVar6[8]);
              auVar66[9] = -(cVar74 == pcVar6[9]);
              auVar66[10] = -(cVar76 == pcVar6[10]);
              auVar66[0xb] = -(cVar78 == pcVar6[0xb]);
              auVar66[0xc] = -(cVar55 == pcVar6[0xc]);
              auVar66[0xd] = -(cVar74 == pcVar6[0xd]);
              auVar66[0xe] = -(cVar76 == pcVar6[0xe]);
              auVar66[0xf] = -(cVar78 == pcVar6[0xf]);
              uVar13 = (ushort)(SUB161(auVar66 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar66 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar66 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar66 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar66 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar66 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar66 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar66 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar66 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar66 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar66 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar66 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar66 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar66 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar66 >> 0x77,0) & 1) << 0xe |
                       (ushort)(auVar66[0xf] >> 7) << 0xf;
              uVar44 = (uint)uVar13;
              if ((bVar28 & 0xf) != 0) {
                uVar44 = (uint)uVar13 << (0x10 - (bVar28 & 0xf) & 0x1f) & 0xfffe |
                         (uint)(uVar13 >> (bVar28 & 0xf));
              }
              if (uVar44 == 0) {
                lVar41 = 0;
              }
              else {
                lVar47 = 0;
                while( true ) {
                  iVar18 = 0;
                  if (uVar44 != 0) {
                    for (; (uVar44 >> iVar18 & 1) == 0; iVar18 = iVar18 + 1) {
                    }
                  }
                  lVar41 = lVar47;
                  if (pUVar11[uVar24 + (iVar18 + (uint)bVar28 & 0xf)] < uVar30) break;
                  lVar41 = lVar47 + 1;
                  auStack_b8[lVar47] = pUVar11[uVar24 + (iVar18 + (uint)bVar28 & 0xf)];
                  uVar44 = uVar44 & uVar44 - 1;
                  if ((uVar44 == 0) ||
                     (iVar18 = (int)lVar47, lVar47 = lVar41,
                     (int)(1L << (bVar27 & 0x3f)) + -1 == iVar18)) break;
                }
              }
              uVar44 = bVar28 - 1 & 0xf;
              *(char *)(pUVar12 + uVar24) = (char)uVar44;
              *(undefined1 *)((long)(pUVar12 + uVar24) + (ulong)uVar44 + 1) = auVar65[0];
              UVar48 = ms->nextToUpdate;
              ms->nextToUpdate = UVar48 + 1;
              pUVar11[uVar24 + uVar44] = UVar48;
              if (lVar41 == 0) goto LAB_0020021e;
              local_1c8 = 999999999;
              lVar47 = 0;
              uVar24 = 3;
              do {
                uVar44 = auStack_b8[lVar47];
                uVar43 = (ulong)uVar44;
                if (uVar44 < uVar33) {
                  if (*(int *)(pBVar34 + uVar43) == *(int *)puVar31) {
                    sVar21 = ZSTD_count_2segments
                                       ((BYTE *)((long)puVar36 + 5),pBVar34 + uVar43 + 4,
                                        (BYTE *)iEnd,pBVar34 + uVar33,pBVar26 + uVar33);
                    pBVar38 = (BYTE *)(sVar21 + 4);
LAB_001ffa67:
                    if ((uVar24 < pBVar38) &&
                       (local_1c8 = (ulong)((uVar19 + 2) - uVar44), uVar24 = (ulong)pBVar38,
                       (ulong *)((long)puVar31 + (long)pBVar38) == iEnd)) break;
                  }
                }
                else {
                  puVar25 = (ulong *)(pBVar26 + uVar43);
                  if (*(BYTE *)(uVar24 + (long)puVar25) == *(BYTE *)((long)puVar31 + uVar24)) {
                    puVar39 = puVar31;
                    if (puVar31 < puVar1) {
                      if (*puVar25 == *puVar31) {
                        lVar32 = 0;
                        do {
                          puVar39 = (ulong *)(local_180 + lVar32);
                          if (puVar1 <= puVar39) {
                            puVar25 = (ulong *)(pBVar26 + lVar32 + uVar43 + 8);
                            goto LAB_001ffa21;
                          }
                          lVar15 = lVar32 + uVar43 + 8;
                          lVar32 = lVar32 + 8;
                        } while (*(ulong *)(pBVar26 + lVar15) == *puVar39);
                        uVar40 = *puVar39 ^ *(ulong *)(pBVar26 + lVar15);
                        uVar43 = 0;
                        if (uVar40 != 0) {
                          for (; (uVar40 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                          }
                        }
                        pBVar38 = (BYTE *)((uVar43 >> 3 & 0x1fffffff) + lVar32);
                      }
                      else {
                        uVar40 = *puVar31 ^ *puVar25;
                        uVar43 = 0;
                        if (uVar40 != 0) {
                          for (; (uVar40 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                          }
                        }
                        pBVar38 = (BYTE *)(uVar43 >> 3 & 0x1fffffff);
                      }
                    }
                    else {
LAB_001ffa21:
                      if ((puVar39 < puVar2) && ((int)*puVar25 == (int)*puVar39)) {
                        puVar39 = (ulong *)((long)puVar39 + 4);
                        puVar25 = (ulong *)((long)puVar25 + 4);
                      }
                      if ((puVar39 < puVar3) && ((short)*puVar25 == (short)*puVar39)) {
                        puVar39 = (ulong *)((long)puVar39 + 2);
                        puVar25 = (ulong *)((long)puVar25 + 2);
                      }
                      if (puVar39 < iEnd) {
                        puVar39 = (ulong *)((long)puVar39 +
                                           (ulong)((BYTE)*puVar25 == (BYTE)*puVar39));
                      }
                      pBVar38 = (BYTE *)((long)puVar39 - (long)puVar31);
                    }
                    goto LAB_001ffa67;
                  }
                }
                pBVar38 = (BYTE *)uVar24;
                lVar47 = lVar47 + 1;
                uVar24 = (ulong)pBVar38;
              } while (lVar47 != lVar41);
            }
            else if (uVar30 == 5) {
              pUVar11 = ms->hashTable;
              pUVar12 = ms->tagTable;
              pBVar26 = (ms->window).base;
              uVar24 = (long)puVar31 - (long)pBVar26;
              uVar33 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
              uVar44 = (ms->window).lowLimit;
              uVar19 = (uint)uVar24;
              uVar30 = uVar19 - uVar33;
              if (uVar19 - uVar44 <= uVar33) {
                uVar30 = uVar44;
              }
              pBVar34 = (ms->window).dictBase;
              uVar33 = (ms->window).dictLimit;
              if (ms->loadedDictEnd != 0) {
                uVar30 = uVar44;
              }
              uVar43 = (ulong)ms->nextToUpdate;
              bVar28 = 0x38 - (char)ms->rowHashLog;
              if (ms->nextToUpdate < uVar19) {
                do {
                  uVar45 = (uint)uVar43 & 7;
                  uVar44 = ms->hashCache[uVar45];
                  ms->hashCache[uVar45] =
                       (U32)((ulong)(*(long *)(pBVar26 + uVar43 + 8) * -0x30e4432345000000) >>
                            (bVar28 & 0x3f));
                  uVar40 = (ulong)(uVar44 >> 4 & 0xfffffff0);
                  uVar45 = (byte)((char)pUVar12[uVar40] - 1) & 0xf;
                  *(char *)(pUVar12 + uVar40) = (char)uVar45;
                  *(char *)((long)pUVar12 + (ulong)uVar45 + 1 + uVar40 * 2) = (char)uVar44;
                  pUVar11[uVar40 + uVar45] = (uint)uVar43;
                  uVar43 = uVar43 + 1;
                } while (uVar43 < (uVar24 & 0xffffffff));
              }
              ms->nextToUpdate = uVar19;
              uVar44 = ms->hashCache[uVar19 & 7];
              ms->hashCache[uVar19 & 7] =
                   (U32)((ulong)(*(long *)(pBVar26 + (uVar24 & 0xffffffff) + 8) *
                                -0x30e4432345000000) >> (bVar28 & 0x3f));
              uVar24 = (ulong)(uVar44 >> 4 & 0xfffffff0);
              bVar28 = (byte)pUVar12[uVar24];
              pcVar6 = (char *)((long)pUVar12 + uVar24 * 2 + 1);
              uVar77 = (undefined1)(uVar44 >> 0x18);
              uVar75 = (undefined1)(uVar44 >> 0x10);
              uVar73 = (undefined1)(uVar44 >> 8);
              auVar68._4_4_ =
                   (int)(CONCAT35(CONCAT21(CONCAT11(uVar77,uVar77),uVar75),CONCAT14(uVar75,uVar44))
                        >> 0x20);
              auVar68[3] = uVar73;
              auVar68[2] = uVar73;
              auVar68[0] = (undefined1)uVar44;
              auVar68[1] = auVar68[0];
              auVar68._8_8_ = 0;
              auVar80 = pshuflw(auVar68,auVar68,0);
              cVar55 = auVar80[0];
              auVar69[0] = -(cVar55 == *pcVar6);
              cVar74 = auVar80[1];
              auVar69[1] = -(cVar74 == pcVar6[1]);
              cVar76 = auVar80[2];
              auVar69[2] = -(cVar76 == pcVar6[2]);
              cVar78 = auVar80[3];
              auVar69[3] = -(cVar78 == pcVar6[3]);
              auVar69[4] = -(cVar55 == pcVar6[4]);
              auVar69[5] = -(cVar74 == pcVar6[5]);
              auVar69[6] = -(cVar76 == pcVar6[6]);
              auVar69[7] = -(cVar78 == pcVar6[7]);
              auVar69[8] = -(cVar55 == pcVar6[8]);
              auVar69[9] = -(cVar74 == pcVar6[9]);
              auVar69[10] = -(cVar76 == pcVar6[10]);
              auVar69[0xb] = -(cVar78 == pcVar6[0xb]);
              auVar69[0xc] = -(cVar55 == pcVar6[0xc]);
              auVar69[0xd] = -(cVar74 == pcVar6[0xd]);
              auVar69[0xe] = -(cVar76 == pcVar6[0xe]);
              auVar69[0xf] = -(cVar78 == pcVar6[0xf]);
              uVar13 = (ushort)(SUB161(auVar69 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar69 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar69 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar69 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar69 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar69 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar69 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar69 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar69 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar69 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar69 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar69 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar69 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar69 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar69 >> 0x77,0) & 1) << 0xe |
                       (ushort)(auVar69[0xf] >> 7) << 0xf;
              uVar44 = (uint)uVar13;
              if ((bVar28 & 0xf) != 0) {
                uVar44 = (uint)uVar13 << (0x10 - (bVar28 & 0xf) & 0x1f) & 0xfffe |
                         (uint)(uVar13 >> (bVar28 & 0xf));
              }
              if (uVar44 == 0) {
                lVar41 = 0;
              }
              else {
                lVar47 = 0;
                while( true ) {
                  iVar18 = 0;
                  if (uVar44 != 0) {
                    for (; (uVar44 >> iVar18 & 1) == 0; iVar18 = iVar18 + 1) {
                    }
                  }
                  lVar41 = lVar47;
                  if (pUVar11[uVar24 + (iVar18 + (uint)bVar28 & 0xf)] < uVar30) break;
                  lVar41 = lVar47 + 1;
                  auStack_b8[lVar47] = pUVar11[uVar24 + (iVar18 + (uint)bVar28 & 0xf)];
                  uVar44 = uVar44 & uVar44 - 1;
                  if ((uVar44 == 0) ||
                     (iVar18 = (int)lVar47, lVar47 = lVar41, (1 << (bVar27 & 0x1f)) + -1 == iVar18))
                  break;
                }
              }
              uVar44 = bVar28 - 1 & 0xf;
              *(char *)(pUVar12 + uVar24) = (char)uVar44;
              *(undefined1 *)((long)(pUVar12 + uVar24) + (ulong)uVar44 + 1) = auVar68[0];
              UVar48 = ms->nextToUpdate;
              ms->nextToUpdate = UVar48 + 1;
              pUVar11[uVar24 + uVar44] = UVar48;
              if (lVar41 == 0) goto LAB_0020021e;
              local_1c8 = 999999999;
              lVar47 = 0;
              uVar24 = 3;
              do {
                uVar44 = auStack_b8[lVar47];
                uVar43 = (ulong)uVar44;
                if (uVar44 < uVar33) {
                  if (*(int *)(pBVar34 + uVar43) == *(int *)puVar31) {
                    sVar21 = ZSTD_count_2segments
                                       ((BYTE *)((long)puVar36 + 5),pBVar34 + uVar43 + 4,
                                        (BYTE *)iEnd,pBVar34 + uVar33,pBVar26 + uVar33);
                    pBVar38 = (BYTE *)(sVar21 + 4);
LAB_001ffe4f:
                    if ((uVar24 < pBVar38) &&
                       (local_1c8 = (ulong)((uVar19 + 2) - uVar44), uVar24 = (ulong)pBVar38,
                       (ulong *)((long)puVar31 + (long)pBVar38) == iEnd)) break;
                  }
                }
                else {
                  puVar25 = (ulong *)(pBVar26 + uVar43);
                  if (*(BYTE *)(uVar24 + (long)puVar25) == *(BYTE *)((long)puVar31 + uVar24)) {
                    puVar39 = puVar31;
                    if (puVar31 < puVar1) {
                      if (*puVar25 == *puVar31) {
                        lVar32 = 0;
                        do {
                          if (puVar1 <= local_180 + lVar32) {
                            puVar25 = (ulong *)(pBVar26 + lVar32 + uVar43 + 8);
                            puVar39 = (ulong *)(local_180 + lVar32);
                            goto LAB_001ffe09;
                          }
                          lVar15 = lVar32 + uVar43 + 8;
                          uVar40 = *(ulong *)((long)puVar36 + lVar32 + 9);
                          lVar32 = lVar32 + 8;
                        } while (*(ulong *)(pBVar26 + lVar15) == uVar40);
                        uVar40 = uVar40 ^ *(ulong *)(pBVar26 + lVar15);
                        uVar43 = 0;
                        if (uVar40 != 0) {
                          for (; (uVar40 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                          }
                        }
                        pBVar38 = (BYTE *)((uVar43 >> 3 & 0x1fffffff) + lVar32);
                      }
                      else {
                        uVar40 = *puVar31 ^ *puVar25;
                        uVar43 = 0;
                        if (uVar40 != 0) {
                          for (; (uVar40 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                          }
                        }
                        pBVar38 = (BYTE *)(uVar43 >> 3 & 0x1fffffff);
                      }
                    }
                    else {
LAB_001ffe09:
                      if ((puVar39 < puVar2) && ((int)*puVar25 == (int)*puVar39)) {
                        puVar39 = (ulong *)((long)puVar39 + 4);
                        puVar25 = (ulong *)((long)puVar25 + 4);
                      }
                      if ((puVar39 < puVar3) && ((short)*puVar25 == (short)*puVar39)) {
                        puVar39 = (ulong *)((long)puVar39 + 2);
                        puVar25 = (ulong *)((long)puVar25 + 2);
                      }
                      if (puVar39 < iEnd) {
                        puVar39 = (ulong *)((long)puVar39 +
                                           (ulong)((BYTE)*puVar25 == (BYTE)*puVar39));
                      }
                      pBVar38 = (BYTE *)((long)puVar39 - (long)puVar31);
                    }
                    goto LAB_001ffe4f;
                  }
                }
                pBVar38 = (BYTE *)uVar24;
                lVar47 = lVar47 + 1;
                uVar24 = (ulong)pBVar38;
              } while (lVar47 != lVar41);
            }
            else {
              pUVar11 = ms->hashTable;
              pUVar12 = ms->tagTable;
              pBVar26 = (ms->window).base;
              uVar24 = (long)puVar31 - (long)pBVar26;
              uVar33 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
              uVar44 = (ms->window).lowLimit;
              uVar19 = (uint)uVar24;
              uVar30 = uVar19 - uVar33;
              if (uVar19 - uVar44 <= uVar33) {
                uVar30 = uVar44;
              }
              pBVar34 = (ms->window).dictBase;
              uVar33 = (ms->window).dictLimit;
              if (ms->loadedDictEnd != 0) {
                uVar30 = uVar44;
              }
              uVar43 = (ulong)ms->nextToUpdate;
              bVar28 = 0x18 - (char)ms->rowHashLog;
              if (ms->nextToUpdate < uVar19) {
                do {
                  uVar45 = (uint)uVar43 & 7;
                  uVar44 = ms->hashCache[uVar45];
                  ms->hashCache[uVar45] =
                       (uint)(*(int *)(pBVar26 + uVar43 + 8) * -0x61c8864f) >> (bVar28 & 0x1f);
                  uVar40 = (ulong)(uVar44 >> 4 & 0xfffffff0);
                  uVar45 = (byte)((char)pUVar12[uVar40] - 1) & 0xf;
                  *(char *)(pUVar12 + uVar40) = (char)uVar45;
                  *(char *)((long)pUVar12 + (ulong)uVar45 + 1 + uVar40 * 2) = (char)uVar44;
                  pUVar11[uVar40 + uVar45] = (uint)uVar43;
                  uVar43 = uVar43 + 1;
                } while (uVar43 < (uVar24 & 0xffffffff));
              }
              ms->nextToUpdate = uVar19;
              uVar44 = ms->hashCache[uVar19 & 7];
              ms->hashCache[uVar19 & 7] =
                   (uint)(*(int *)(pBVar26 + (uVar24 & 0xffffffff) + 8) * -0x61c8864f) >>
                   (bVar28 & 0x1f);
              uVar24 = (ulong)(uVar44 >> 4 & 0xfffffff0);
              bVar28 = (byte)pUVar12[uVar24];
              pcVar6 = (char *)((long)pUVar12 + uVar24 * 2 + 1);
              uVar77 = (undefined1)(uVar44 >> 0x18);
              uVar75 = (undefined1)(uVar44 >> 0x10);
              uVar73 = (undefined1)(uVar44 >> 8);
              auVar71._4_4_ =
                   (int)(CONCAT35(CONCAT21(CONCAT11(uVar77,uVar77),uVar75),CONCAT14(uVar75,uVar44))
                        >> 0x20);
              auVar71[3] = uVar73;
              auVar71[2] = uVar73;
              auVar71[0] = (undefined1)uVar44;
              auVar71[1] = auVar71[0];
              auVar71._8_8_ = 0;
              auVar80 = pshuflw(auVar71,auVar71,0);
              cVar55 = auVar80[0];
              auVar72[0] = -(cVar55 == *pcVar6);
              cVar74 = auVar80[1];
              auVar72[1] = -(cVar74 == pcVar6[1]);
              cVar76 = auVar80[2];
              auVar72[2] = -(cVar76 == pcVar6[2]);
              cVar78 = auVar80[3];
              auVar72[3] = -(cVar78 == pcVar6[3]);
              auVar72[4] = -(cVar55 == pcVar6[4]);
              auVar72[5] = -(cVar74 == pcVar6[5]);
              auVar72[6] = -(cVar76 == pcVar6[6]);
              auVar72[7] = -(cVar78 == pcVar6[7]);
              auVar72[8] = -(cVar55 == pcVar6[8]);
              auVar72[9] = -(cVar74 == pcVar6[9]);
              auVar72[10] = -(cVar76 == pcVar6[10]);
              auVar72[0xb] = -(cVar78 == pcVar6[0xb]);
              auVar72[0xc] = -(cVar55 == pcVar6[0xc]);
              auVar72[0xd] = -(cVar74 == pcVar6[0xd]);
              auVar72[0xe] = -(cVar76 == pcVar6[0xe]);
              auVar72[0xf] = -(cVar78 == pcVar6[0xf]);
              uVar13 = (ushort)(SUB161(auVar72 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar72 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar72 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar72 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar72 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar72 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar72 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar72 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar72 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar72 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar72 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar72 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar72 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar72 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar72 >> 0x77,0) & 1) << 0xe |
                       (ushort)(auVar72[0xf] >> 7) << 0xf;
              uVar44 = (uint)uVar13;
              if ((bVar28 & 0xf) != 0) {
                uVar44 = (uint)uVar13 << (0x10 - (bVar28 & 0xf) & 0x1f) & 0xfffe |
                         (uint)(uVar13 >> (bVar28 & 0xf));
              }
              if (uVar44 == 0) {
                lVar41 = 0;
              }
              else {
                lVar47 = 0;
                while( true ) {
                  iVar18 = 0;
                  if (uVar44 != 0) {
                    for (; (uVar44 >> iVar18 & 1) == 0; iVar18 = iVar18 + 1) {
                    }
                  }
                  lVar41 = lVar47;
                  if (pUVar11[uVar24 + (iVar18 + (uint)bVar28 & 0xf)] < uVar30) break;
                  lVar41 = lVar47 + 1;
                  auStack_b8[lVar47] = pUVar11[uVar24 + (iVar18 + (uint)bVar28 & 0xf)];
                  uVar44 = uVar44 & uVar44 - 1;
                  if ((uVar44 == 0) ||
                     (iVar18 = (int)lVar47, lVar47 = lVar41,
                     (int)(1L << (bVar27 & 0x3f)) + -1 == iVar18)) break;
                }
              }
              uVar44 = bVar28 - 1 & 0xf;
              *(char *)(pUVar12 + uVar24) = (char)uVar44;
              *(undefined1 *)((long)(pUVar12 + uVar24) + (ulong)uVar44 + 1) = auVar71[0];
              UVar48 = ms->nextToUpdate;
              ms->nextToUpdate = UVar48 + 1;
              pUVar11[uVar24 + uVar44] = UVar48;
              if (lVar41 == 0) goto LAB_0020021e;
              local_1c8 = 999999999;
              lVar47 = 0;
              uVar24 = 3;
              do {
                uVar44 = auStack_b8[lVar47];
                uVar43 = (ulong)uVar44;
                if (uVar44 < uVar33) {
                  if (*(int *)(pBVar34 + uVar43) == *(int *)puVar31) {
                    sVar21 = ZSTD_count_2segments
                                       ((BYTE *)((long)puVar36 + 5),pBVar34 + uVar43 + 4,
                                        (BYTE *)iEnd,pBVar34 + uVar33,pBVar26 + uVar33);
                    pBVar38 = (BYTE *)(sVar21 + 4);
LAB_002001f0:
                    if ((uVar24 < pBVar38) &&
                       (local_1c8 = (ulong)((uVar19 + 2) - uVar44), uVar24 = (ulong)pBVar38,
                       (ulong *)((long)puVar31 + (long)pBVar38) == iEnd)) break;
                  }
                }
                else {
                  puVar25 = (ulong *)(pBVar26 + uVar43);
                  if (*(BYTE *)(uVar24 + (long)puVar25) == *(BYTE *)((long)puVar31 + uVar24)) {
                    puVar39 = puVar31;
                    if (puVar31 < puVar1) {
                      if (*puVar25 == *puVar31) {
                        lVar32 = 0;
                        do {
                          puVar39 = (ulong *)(local_180 + lVar32);
                          if (puVar1 <= puVar39) {
                            puVar25 = (ulong *)(pBVar26 + lVar32 + uVar43 + 8);
                            goto LAB_002001aa;
                          }
                          lVar15 = lVar32 + uVar43 + 8;
                          lVar32 = lVar32 + 8;
                        } while (*(ulong *)(pBVar26 + lVar15) == *puVar39);
                        uVar40 = *puVar39 ^ *(ulong *)(pBVar26 + lVar15);
                        uVar43 = 0;
                        if (uVar40 != 0) {
                          for (; (uVar40 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                          }
                        }
                        pBVar38 = (BYTE *)((uVar43 >> 3 & 0x1fffffff) + lVar32);
                      }
                      else {
                        uVar40 = *puVar31 ^ *puVar25;
                        uVar43 = 0;
                        if (uVar40 != 0) {
                          for (; (uVar40 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                          }
                        }
                        pBVar38 = (BYTE *)(uVar43 >> 3 & 0x1fffffff);
                      }
                    }
                    else {
LAB_002001aa:
                      if ((puVar39 < puVar2) && ((int)*puVar25 == (int)*puVar39)) {
                        puVar39 = (ulong *)((long)puVar39 + 4);
                        puVar25 = (ulong *)((long)puVar25 + 4);
                      }
                      if ((puVar39 < puVar3) && ((short)*puVar25 == (short)*puVar39)) {
                        puVar39 = (ulong *)((long)puVar39 + 2);
                        puVar25 = (ulong *)((long)puVar25 + 2);
                      }
                      if (puVar39 < iEnd) {
                        puVar39 = (ulong *)((long)puVar39 +
                                           (ulong)((BYTE)*puVar25 == (BYTE)*puVar39));
                      }
                      pBVar38 = (BYTE *)((long)puVar39 - (long)puVar31);
                    }
                    goto LAB_002001f0;
                  }
                }
                pBVar38 = (BYTE *)uVar24;
                lVar47 = lVar47 + 1;
                uVar24 = (ulong)pBVar38;
              } while (lVar47 != lVar41);
            }
          }
          else if (uVar30 - 6 < 2) {
            pUVar11 = ms->hashTable;
            pBVar26 = (ms->window).base;
            uVar24 = (long)puVar31 - (long)pBVar26;
            uVar33 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            uVar44 = (ms->window).lowLimit;
            uVar19 = (uint)uVar24;
            uVar30 = uVar19 - uVar33;
            if (uVar19 - uVar44 <= uVar33) {
              uVar30 = uVar44;
            }
            pUVar12 = ms->tagTable;
            pBVar34 = (ms->window).dictBase;
            uVar33 = (ms->window).dictLimit;
            if (ms->loadedDictEnd != 0) {
              uVar30 = uVar44;
            }
            uVar43 = (ulong)ms->nextToUpdate;
            bVar27 = 0x38 - (char)ms->rowHashLog;
            if (ms->nextToUpdate < uVar19) {
              do {
                uVar45 = (uint)uVar43 & 7;
                uVar44 = ms->hashCache[uVar45];
                ms->hashCache[uVar45] =
                     (U32)((ulong)(*(long *)(pBVar26 + uVar43 + 8) * -0x30e4432340650000) >>
                          (bVar27 & 0x3f));
                uVar40 = (ulong)(uVar44 >> 3 & 0xffffffe0);
                uVar45 = (byte)((char)pUVar12[uVar40] - 1) & 0x1f;
                *(char *)(pUVar12 + uVar40) = (char)uVar45;
                *(char *)((long)pUVar12 + (ulong)uVar45 + 1 + uVar40 * 2) = (char)uVar44;
                pUVar11[uVar40 + uVar45] = (uint)uVar43;
                uVar43 = uVar43 + 1;
              } while (uVar43 < (uVar24 & 0xffffffff));
            }
            ms->nextToUpdate = uVar19;
            uVar44 = ms->hashCache[uVar19 & 7];
            ms->hashCache[uVar19 & 7] =
                 (U32)((ulong)(*(long *)(pBVar26 + (uVar24 & 0xffffffff) + 8) * -0x30e4432340650000)
                      >> (bVar27 & 0x3f));
            uVar24 = (ulong)(uVar44 >> 3 & 0xffffffe0);
            bVar27 = (byte)pUVar12[uVar24];
            pcVar6 = (char *)((long)pUVar12 + uVar24 * 2 + 1);
            pcVar7 = (char *)((long)pUVar12 + uVar24 * 2 + 0x11);
            uVar77 = (undefined1)(uVar44 >> 0x18);
            uVar75 = (undefined1)(uVar44 >> 0x10);
            uVar73 = (undefined1)(uVar44 >> 8);
            auVar83._4_4_ =
                 (int)(CONCAT35(CONCAT21(CONCAT11(uVar77,uVar77),uVar75),CONCAT14(uVar75,uVar44)) >>
                      0x20);
            auVar83[3] = uVar73;
            auVar83[2] = uVar73;
            auVar83[0] = (undefined1)uVar44;
            auVar83[1] = auVar83[0];
            auVar83._8_8_ = 0;
            auVar80 = pshuflw(auVar83,auVar83,0);
            cVar55 = auVar80[0];
            auVar52[0] = -(*pcVar6 == cVar55);
            cVar74 = auVar80[1];
            auVar52[1] = -(pcVar6[1] == cVar74);
            cVar76 = auVar80[2];
            auVar52[2] = -(pcVar6[2] == cVar76);
            cVar78 = auVar80[3];
            auVar52[3] = -(pcVar6[3] == cVar78);
            auVar52[4] = -(pcVar6[4] == cVar55);
            auVar52[5] = -(pcVar6[5] == cVar74);
            auVar52[6] = -(pcVar6[6] == cVar76);
            auVar52[7] = -(pcVar6[7] == cVar78);
            auVar52[8] = -(pcVar6[8] == cVar55);
            auVar52[9] = -(pcVar6[9] == cVar74);
            auVar52[10] = -(pcVar6[10] == cVar76);
            auVar52[0xb] = -(pcVar6[0xb] == cVar78);
            auVar52[0xc] = -(pcVar6[0xc] == cVar55);
            auVar52[0xd] = -(pcVar6[0xd] == cVar74);
            auVar52[0xe] = -(pcVar6[0xe] == cVar76);
            auVar52[0xf] = -(pcVar6[0xf] == cVar78);
            auVar64[0] = -(*pcVar7 == cVar55);
            auVar64[1] = -(pcVar7[1] == cVar74);
            auVar64[2] = -(pcVar7[2] == cVar76);
            auVar64[3] = -(pcVar7[3] == cVar78);
            auVar64[4] = -(pcVar7[4] == cVar55);
            auVar64[5] = -(pcVar7[5] == cVar74);
            auVar64[6] = -(pcVar7[6] == cVar76);
            auVar64[7] = -(pcVar7[7] == cVar78);
            auVar64[8] = -(pcVar7[8] == cVar55);
            auVar64[9] = -(pcVar7[9] == cVar74);
            auVar64[10] = -(pcVar7[10] == cVar76);
            auVar64[0xb] = -(pcVar7[0xb] == cVar78);
            auVar64[0xc] = -(pcVar7[0xc] == cVar55);
            auVar64[0xd] = -(pcVar7[0xd] == cVar74);
            auVar64[0xe] = -(pcVar7[0xe] == cVar76);
            auVar64[0xf] = -(pcVar7[0xf] == cVar78);
            uVar45 = CONCAT22((ushort)(SUB161(auVar64 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar64 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar64 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar64 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar64 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar64 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar64 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar64 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar64 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar64 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar64 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar64 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar64 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar64 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar64 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar64[0xf] >> 7) << 0xf,
                              (ushort)(SUB161(auVar52 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar52 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar52 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar52 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar52 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar52 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar52 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar52 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar52 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar52 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar52 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar52 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar52 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar52 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar52 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar52[0xf] >> 7) << 0xf);
            uVar44 = uVar45 >> (bVar27 & 0x1f) | uVar45 << 0x20 - (bVar27 & 0x1f);
            if ((bVar27 & 0x1f) == 0) {
              uVar44 = uVar45;
            }
            if (uVar44 == 0) {
              lVar41 = 0;
            }
            else {
              lVar47 = 0;
              while( true ) {
                iVar18 = 0;
                if (uVar44 != 0) {
                  for (; (uVar44 >> iVar18 & 1) == 0; iVar18 = iVar18 + 1) {
                  }
                }
                lVar41 = lVar47;
                if (pUVar11[uVar24 + (iVar18 + (uint)bVar27 & 0x1f)] < uVar30) break;
                lVar41 = lVar47 + 1;
                auStack_b8[lVar47] = pUVar11[uVar24 + (iVar18 + (uint)bVar27 & 0x1f)];
                uVar44 = uVar44 & uVar44 - 1;
                if ((uVar44 == 0) || (iVar18 = (int)lVar47, lVar47 = lVar41, iVar18 == 0x1f)) break;
              }
            }
            uVar44 = bVar27 - 1 & 0x1f;
            *(char *)(pUVar12 + uVar24) = (char)uVar44;
            *(undefined1 *)((long)(pUVar12 + uVar24) + (ulong)uVar44 + 1) = auVar83[0];
            UVar48 = ms->nextToUpdate;
            ms->nextToUpdate = UVar48 + 1;
            pUVar11[uVar24 + uVar44] = UVar48;
            if (lVar41 == 0) goto LAB_0020021e;
            local_1c8 = 999999999;
            lVar47 = 0;
            uVar24 = 3;
            do {
              uVar44 = auStack_b8[lVar47];
              uVar43 = (ulong)uVar44;
              if (uVar44 < uVar33) {
                if (*(int *)(pBVar34 + uVar43) == *(int *)puVar31) {
                  sVar21 = ZSTD_count_2segments
                                     ((BYTE *)((long)puVar36 + 5),pBVar34 + uVar43 + 4,(BYTE *)iEnd,
                                      pBVar34 + uVar33,pBVar26 + uVar33);
                  pBVar38 = (BYTE *)(sVar21 + 4);
LAB_001ff89e:
                  if ((uVar24 < pBVar38) &&
                     (local_1c8 = (ulong)((uVar19 + 2) - uVar44), uVar24 = (ulong)pBVar38,
                     (ulong *)((long)puVar31 + (long)pBVar38) == iEnd)) break;
                }
              }
              else {
                puVar25 = (ulong *)(pBVar26 + uVar43);
                if (*(BYTE *)(uVar24 + (long)puVar25) == *(BYTE *)((long)puVar31 + uVar24)) {
                  puVar39 = puVar31;
                  if (puVar31 < puVar1) {
                    if (*puVar25 == *puVar31) {
                      lVar32 = 0;
                      do {
                        puVar39 = (ulong *)(local_180 + lVar32);
                        if (puVar1 <= puVar39) {
                          puVar25 = (ulong *)(pBVar26 + lVar32 + uVar43 + 8);
                          goto LAB_001ff858;
                        }
                        lVar15 = lVar32 + uVar43 + 8;
                        lVar32 = lVar32 + 8;
                      } while (*(ulong *)(pBVar26 + lVar15) == *puVar39);
                      uVar40 = *puVar39 ^ *(ulong *)(pBVar26 + lVar15);
                      uVar43 = 0;
                      if (uVar40 != 0) {
                        for (; (uVar40 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                        }
                      }
                      pBVar38 = (BYTE *)((uVar43 >> 3 & 0x1fffffff) + lVar32);
                    }
                    else {
                      uVar40 = *puVar31 ^ *puVar25;
                      uVar43 = 0;
                      if (uVar40 != 0) {
                        for (; (uVar40 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                        }
                      }
                      pBVar38 = (BYTE *)(uVar43 >> 3 & 0x1fffffff);
                    }
                  }
                  else {
LAB_001ff858:
                    if ((puVar39 < puVar2) && ((int)*puVar25 == (int)*puVar39)) {
                      puVar39 = (ulong *)((long)puVar39 + 4);
                      puVar25 = (ulong *)((long)puVar25 + 4);
                    }
                    if ((puVar39 < puVar3) && ((short)*puVar25 == (short)*puVar39)) {
                      puVar39 = (ulong *)((long)puVar39 + 2);
                      puVar25 = (ulong *)((long)puVar25 + 2);
                    }
                    if (puVar39 < iEnd) {
                      puVar39 = (ulong *)((long)puVar39 + (ulong)((BYTE)*puVar25 == (BYTE)*puVar39))
                      ;
                    }
                    pBVar38 = (BYTE *)((long)puVar39 - (long)puVar31);
                  }
                  goto LAB_001ff89e;
                }
              }
              pBVar38 = (BYTE *)uVar24;
              lVar47 = lVar47 + 1;
              uVar24 = (ulong)pBVar38;
            } while (lVar47 != lVar41);
          }
          else if (uVar30 == 5) {
            pUVar11 = ms->hashTable;
            pBVar26 = (ms->window).base;
            uVar24 = (long)puVar31 - (long)pBVar26;
            uVar33 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            uVar44 = (ms->window).lowLimit;
            uVar19 = (uint)uVar24;
            uVar30 = uVar19 - uVar33;
            if (uVar19 - uVar44 <= uVar33) {
              uVar30 = uVar44;
            }
            pUVar12 = ms->tagTable;
            pBVar34 = (ms->window).dictBase;
            uVar33 = (ms->window).dictLimit;
            if (ms->loadedDictEnd != 0) {
              uVar30 = uVar44;
            }
            uVar43 = (ulong)ms->nextToUpdate;
            bVar27 = 0x38 - (char)ms->rowHashLog;
            if (ms->nextToUpdate < uVar19) {
              do {
                uVar45 = (uint)uVar43 & 7;
                uVar44 = ms->hashCache[uVar45];
                ms->hashCache[uVar45] =
                     (U32)((ulong)(*(long *)(pBVar26 + uVar43 + 8) * -0x30e4432345000000) >>
                          (bVar27 & 0x3f));
                uVar40 = (ulong)(uVar44 >> 3 & 0xffffffe0);
                uVar45 = (byte)((char)pUVar12[uVar40] - 1) & 0x1f;
                *(char *)(pUVar12 + uVar40) = (char)uVar45;
                *(char *)((long)pUVar12 + (ulong)uVar45 + 1 + uVar40 * 2) = (char)uVar44;
                pUVar11[uVar40 + uVar45] = (uint)uVar43;
                uVar43 = uVar43 + 1;
              } while (uVar43 < (uVar24 & 0xffffffff));
            }
            ms->nextToUpdate = uVar19;
            uVar44 = ms->hashCache[uVar19 & 7];
            ms->hashCache[uVar19 & 7] =
                 (U32)((ulong)(*(long *)(pBVar26 + (uVar24 & 0xffffffff) + 8) * -0x30e4432345000000)
                      >> (bVar27 & 0x3f));
            uVar24 = (ulong)(uVar44 >> 3 & 0xffffffe0);
            bVar27 = (byte)pUVar12[uVar24];
            pcVar6 = (char *)((long)pUVar12 + uVar24 * 2 + 1);
            pcVar7 = (char *)((long)pUVar12 + uVar24 * 2 + 0x11);
            uVar77 = (undefined1)(uVar44 >> 0x18);
            uVar75 = (undefined1)(uVar44 >> 0x10);
            uVar73 = (undefined1)(uVar44 >> 8);
            auVar84._4_4_ =
                 (int)(CONCAT35(CONCAT21(CONCAT11(uVar77,uVar77),uVar75),CONCAT14(uVar75,uVar44)) >>
                      0x20);
            auVar84[3] = uVar73;
            auVar84[2] = uVar73;
            auVar84[0] = (undefined1)uVar44;
            auVar84[1] = auVar84[0];
            auVar84._8_8_ = 0;
            auVar80 = pshuflw(auVar84,auVar84,0);
            cVar55 = auVar80[0];
            auVar53[0] = -(*pcVar6 == cVar55);
            cVar74 = auVar80[1];
            auVar53[1] = -(pcVar6[1] == cVar74);
            cVar76 = auVar80[2];
            auVar53[2] = -(pcVar6[2] == cVar76);
            cVar78 = auVar80[3];
            auVar53[3] = -(pcVar6[3] == cVar78);
            auVar53[4] = -(pcVar6[4] == cVar55);
            auVar53[5] = -(pcVar6[5] == cVar74);
            auVar53[6] = -(pcVar6[6] == cVar76);
            auVar53[7] = -(pcVar6[7] == cVar78);
            auVar53[8] = -(pcVar6[8] == cVar55);
            auVar53[9] = -(pcVar6[9] == cVar74);
            auVar53[10] = -(pcVar6[10] == cVar76);
            auVar53[0xb] = -(pcVar6[0xb] == cVar78);
            auVar53[0xc] = -(pcVar6[0xc] == cVar55);
            auVar53[0xd] = -(pcVar6[0xd] == cVar74);
            auVar53[0xe] = -(pcVar6[0xe] == cVar76);
            auVar53[0xf] = -(pcVar6[0xf] == cVar78);
            auVar67[0] = -(*pcVar7 == cVar55);
            auVar67[1] = -(pcVar7[1] == cVar74);
            auVar67[2] = -(pcVar7[2] == cVar76);
            auVar67[3] = -(pcVar7[3] == cVar78);
            auVar67[4] = -(pcVar7[4] == cVar55);
            auVar67[5] = -(pcVar7[5] == cVar74);
            auVar67[6] = -(pcVar7[6] == cVar76);
            auVar67[7] = -(pcVar7[7] == cVar78);
            auVar67[8] = -(pcVar7[8] == cVar55);
            auVar67[9] = -(pcVar7[9] == cVar74);
            auVar67[10] = -(pcVar7[10] == cVar76);
            auVar67[0xb] = -(pcVar7[0xb] == cVar78);
            auVar67[0xc] = -(pcVar7[0xc] == cVar55);
            auVar67[0xd] = -(pcVar7[0xd] == cVar74);
            auVar67[0xe] = -(pcVar7[0xe] == cVar76);
            auVar67[0xf] = -(pcVar7[0xf] == cVar78);
            uVar45 = CONCAT22((ushort)(SUB161(auVar67 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar67 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar67 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar67 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar67 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar67 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar67 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar67 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar67 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar67 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar67 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar67 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar67 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar67 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar67 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar67[0xf] >> 7) << 0xf,
                              (ushort)(SUB161(auVar53 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar53 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar53 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar53 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar53 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar53 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar53 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar53 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar53 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar53 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar53 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar53 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar53 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar53 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar53 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar53[0xf] >> 7) << 0xf);
            uVar44 = uVar45 >> (bVar27 & 0x1f) | uVar45 << 0x20 - (bVar27 & 0x1f);
            if ((bVar27 & 0x1f) == 0) {
              uVar44 = uVar45;
            }
            if (uVar44 == 0) {
              lVar41 = 0;
            }
            else {
              lVar47 = 0;
              while( true ) {
                iVar18 = 0;
                if (uVar44 != 0) {
                  for (; (uVar44 >> iVar18 & 1) == 0; iVar18 = iVar18 + 1) {
                  }
                }
                lVar41 = lVar47;
                if (pUVar11[uVar24 + (iVar18 + (uint)bVar27 & 0x1f)] < uVar30) break;
                lVar41 = lVar47 + 1;
                auStack_b8[lVar47] = pUVar11[uVar24 + (iVar18 + (uint)bVar27 & 0x1f)];
                uVar44 = uVar44 & uVar44 - 1;
                if ((uVar44 == 0) || (iVar18 = (int)lVar47, lVar47 = lVar41, iVar18 == 0x1f)) break;
              }
            }
            uVar44 = bVar27 - 1 & 0x1f;
            *(char *)(pUVar12 + uVar24) = (char)uVar44;
            *(undefined1 *)((long)(pUVar12 + uVar24) + (ulong)uVar44 + 1) = auVar84[0];
            UVar48 = ms->nextToUpdate;
            ms->nextToUpdate = UVar48 + 1;
            pUVar11[uVar24 + uVar44] = UVar48;
            if (lVar41 == 0) {
LAB_0020021e:
              pBVar38 = (BYTE *)0x3;
              local_1c8 = 999999999;
            }
            else {
              local_1c8 = 999999999;
              lVar47 = 0;
              uVar24 = 3;
              do {
                uVar44 = auStack_b8[lVar47];
                uVar43 = (ulong)uVar44;
                if (uVar44 < uVar33) {
                  if (*(int *)(pBVar34 + uVar43) == *(int *)puVar31) {
                    sVar21 = ZSTD_count_2segments
                                       ((BYTE *)((long)puVar36 + 5),pBVar34 + uVar43 + 4,
                                        (BYTE *)iEnd,pBVar34 + uVar33,pBVar26 + uVar33);
                    pBVar38 = (BYTE *)(sVar21 + 4);
LAB_001ffc68:
                    if ((uVar24 < pBVar38) &&
                       (local_1c8 = (ulong)((uVar19 + 2) - uVar44), uVar24 = (ulong)pBVar38,
                       (ulong *)((long)puVar31 + (long)pBVar38) == iEnd)) break;
                  }
                }
                else {
                  puVar25 = (ulong *)(pBVar26 + uVar43);
                  if (*(BYTE *)(uVar24 + (long)puVar25) == *(BYTE *)((long)puVar31 + uVar24)) {
                    puVar39 = puVar31;
                    if (puVar31 < puVar1) {
                      if (*puVar25 == *puVar31) {
                        lVar32 = 0;
                        do {
                          puVar39 = (ulong *)(local_180 + lVar32);
                          if (puVar1 <= puVar39) {
                            puVar25 = (ulong *)(pBVar26 + lVar32 + uVar43 + 8);
                            goto LAB_001ffc22;
                          }
                          lVar15 = lVar32 + uVar43 + 8;
                          lVar32 = lVar32 + 8;
                        } while (*(ulong *)(pBVar26 + lVar15) == *puVar39);
                        uVar40 = *puVar39 ^ *(ulong *)(pBVar26 + lVar15);
                        uVar43 = 0;
                        if (uVar40 != 0) {
                          for (; (uVar40 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                          }
                        }
                        pBVar38 = (BYTE *)((uVar43 >> 3 & 0x1fffffff) + lVar32);
                      }
                      else {
                        uVar40 = *puVar31 ^ *puVar25;
                        uVar43 = 0;
                        if (uVar40 != 0) {
                          for (; (uVar40 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                          }
                        }
                        pBVar38 = (BYTE *)(uVar43 >> 3 & 0x1fffffff);
                      }
                    }
                    else {
LAB_001ffc22:
                      if ((puVar39 < puVar2) && ((int)*puVar25 == (int)*puVar39)) {
                        puVar39 = (ulong *)((long)puVar39 + 4);
                        puVar25 = (ulong *)((long)puVar25 + 4);
                      }
                      if ((puVar39 < puVar3) && ((short)*puVar25 == (short)*puVar39)) {
                        puVar39 = (ulong *)((long)puVar39 + 2);
                        puVar25 = (ulong *)((long)puVar25 + 2);
                      }
                      if (puVar39 < iEnd) {
                        puVar39 = (ulong *)((long)puVar39 +
                                           (ulong)((BYTE)*puVar25 == (BYTE)*puVar39));
                      }
                      pBVar38 = (BYTE *)((long)puVar39 - (long)puVar31);
                    }
                    goto LAB_001ffc68;
                  }
                }
                pBVar38 = (BYTE *)uVar24;
                lVar47 = lVar47 + 1;
                uVar24 = (ulong)pBVar38;
              } while (lVar47 != lVar41);
            }
          }
          else {
            pUVar11 = ms->hashTable;
            pBVar26 = (ms->window).base;
            uVar24 = (long)puVar31 - (long)pBVar26;
            uVar33 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            uVar44 = (ms->window).lowLimit;
            uVar19 = (uint)uVar24;
            uVar30 = uVar19 - uVar33;
            if (uVar19 - uVar44 <= uVar33) {
              uVar30 = uVar44;
            }
            pUVar12 = ms->tagTable;
            pBVar34 = (ms->window).dictBase;
            uVar33 = (ms->window).dictLimit;
            if (ms->loadedDictEnd != 0) {
              uVar30 = uVar44;
            }
            uVar43 = (ulong)ms->nextToUpdate;
            bVar27 = 0x18 - (char)ms->rowHashLog;
            if (ms->nextToUpdate < uVar19) {
              do {
                uVar45 = (uint)uVar43 & 7;
                uVar44 = ms->hashCache[uVar45];
                ms->hashCache[uVar45] =
                     (uint)(*(int *)(pBVar26 + uVar43 + 8) * -0x61c8864f) >> (bVar27 & 0x1f);
                uVar40 = (ulong)(uVar44 >> 3 & 0xffffffe0);
                uVar45 = (byte)((char)pUVar12[uVar40] - 1) & 0x1f;
                *(char *)(pUVar12 + uVar40) = (char)uVar45;
                *(char *)((long)pUVar12 + (ulong)uVar45 + 1 + uVar40 * 2) = (char)uVar44;
                pUVar11[uVar40 + uVar45] = (uint)uVar43;
                uVar43 = uVar43 + 1;
              } while (uVar43 < (uVar24 & 0xffffffff));
            }
            ms->nextToUpdate = uVar19;
            uVar44 = ms->hashCache[uVar19 & 7];
            ms->hashCache[uVar19 & 7] =
                 (uint)(*(int *)(pBVar26 + (uVar24 & 0xffffffff) + 8) * -0x61c8864f) >>
                 (bVar27 & 0x1f);
            uVar24 = (ulong)(uVar44 >> 3 & 0xffffffe0);
            bVar27 = (byte)pUVar12[uVar24];
            pcVar6 = (char *)((long)pUVar12 + uVar24 * 2 + 1);
            pcVar7 = (char *)((long)pUVar12 + uVar24 * 2 + 0x11);
            uVar77 = (undefined1)(uVar44 >> 0x18);
            uVar75 = (undefined1)(uVar44 >> 0x10);
            uVar73 = (undefined1)(uVar44 >> 8);
            auVar85._4_4_ =
                 (int)(CONCAT35(CONCAT21(CONCAT11(uVar77,uVar77),uVar75),CONCAT14(uVar75,uVar44)) >>
                      0x20);
            auVar85[3] = uVar73;
            auVar85[2] = uVar73;
            auVar85[0] = (undefined1)uVar44;
            auVar85[1] = auVar85[0];
            auVar85._8_8_ = 0;
            auVar80 = pshuflw(auVar85,auVar85,0);
            cVar55 = auVar80[0];
            auVar54[0] = -(*pcVar6 == cVar55);
            cVar74 = auVar80[1];
            auVar54[1] = -(pcVar6[1] == cVar74);
            cVar76 = auVar80[2];
            auVar54[2] = -(pcVar6[2] == cVar76);
            cVar78 = auVar80[3];
            auVar54[3] = -(pcVar6[3] == cVar78);
            auVar54[4] = -(pcVar6[4] == cVar55);
            auVar54[5] = -(pcVar6[5] == cVar74);
            auVar54[6] = -(pcVar6[6] == cVar76);
            auVar54[7] = -(pcVar6[7] == cVar78);
            auVar54[8] = -(pcVar6[8] == cVar55);
            auVar54[9] = -(pcVar6[9] == cVar74);
            auVar54[10] = -(pcVar6[10] == cVar76);
            auVar54[0xb] = -(pcVar6[0xb] == cVar78);
            auVar54[0xc] = -(pcVar6[0xc] == cVar55);
            auVar54[0xd] = -(pcVar6[0xd] == cVar74);
            auVar54[0xe] = -(pcVar6[0xe] == cVar76);
            auVar54[0xf] = -(pcVar6[0xf] == cVar78);
            auVar70[0] = -(*pcVar7 == cVar55);
            auVar70[1] = -(pcVar7[1] == cVar74);
            auVar70[2] = -(pcVar7[2] == cVar76);
            auVar70[3] = -(pcVar7[3] == cVar78);
            auVar70[4] = -(pcVar7[4] == cVar55);
            auVar70[5] = -(pcVar7[5] == cVar74);
            auVar70[6] = -(pcVar7[6] == cVar76);
            auVar70[7] = -(pcVar7[7] == cVar78);
            auVar70[8] = -(pcVar7[8] == cVar55);
            auVar70[9] = -(pcVar7[9] == cVar74);
            auVar70[10] = -(pcVar7[10] == cVar76);
            auVar70[0xb] = -(pcVar7[0xb] == cVar78);
            auVar70[0xc] = -(pcVar7[0xc] == cVar55);
            auVar70[0xd] = -(pcVar7[0xd] == cVar74);
            auVar70[0xe] = -(pcVar7[0xe] == cVar76);
            auVar70[0xf] = -(pcVar7[0xf] == cVar78);
            uVar45 = CONCAT22((ushort)(SUB161(auVar70 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar70 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar70 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar70 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar70 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar70 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar70 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar70 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar70 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar70 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar70 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar70 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar70 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar70 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar70 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar70[0xf] >> 7) << 0xf,
                              (ushort)(SUB161(auVar54 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar54 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar54 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar54 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar54 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar54 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar54 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar54 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar54 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar54 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar54 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar54 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar54 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar54 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar54 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar54[0xf] >> 7) << 0xf);
            uVar44 = uVar45 >> (bVar27 & 0x1f) | uVar45 << 0x20 - (bVar27 & 0x1f);
            if ((bVar27 & 0x1f) == 0) {
              uVar44 = uVar45;
            }
            if (uVar44 == 0) {
              lVar41 = 0;
            }
            else {
              lVar47 = 0;
              while( true ) {
                iVar18 = 0;
                if (uVar44 != 0) {
                  for (; (uVar44 >> iVar18 & 1) == 0; iVar18 = iVar18 + 1) {
                  }
                }
                lVar41 = lVar47;
                if (pUVar11[uVar24 + (iVar18 + (uint)bVar27 & 0x1f)] < uVar30) break;
                lVar41 = lVar47 + 1;
                auStack_b8[lVar47] = pUVar11[uVar24 + (iVar18 + (uint)bVar27 & 0x1f)];
                uVar44 = uVar44 & uVar44 - 1;
                if ((uVar44 == 0) || (iVar18 = (int)lVar47, lVar47 = lVar41, iVar18 == 0x1f)) break;
              }
            }
            uVar44 = bVar27 - 1 & 0x1f;
            *(char *)(pUVar12 + uVar24) = (char)uVar44;
            *(undefined1 *)((long)(pUVar12 + uVar24) + (ulong)uVar44 + 1) = auVar85[0];
            UVar48 = ms->nextToUpdate;
            ms->nextToUpdate = UVar48 + 1;
            pUVar11[uVar24 + uVar44] = UVar48;
            if (lVar41 == 0) goto LAB_0020021e;
            local_1c8 = 999999999;
            lVar47 = 0;
            uVar24 = 3;
            do {
              uVar44 = auStack_b8[lVar47];
              uVar43 = (ulong)uVar44;
              if (uVar44 < uVar33) {
                if (*(int *)(pBVar34 + uVar43) == *(int *)puVar31) {
                  sVar21 = ZSTD_count_2segments
                                     ((BYTE *)((long)puVar36 + 5),pBVar34 + uVar43 + 4,(BYTE *)iEnd,
                                      pBVar34 + uVar33,pBVar26 + uVar33);
                  pBVar38 = (BYTE *)(sVar21 + 4);
LAB_00200018:
                  if ((uVar24 < pBVar38) &&
                     (local_1c8 = (ulong)((uVar19 + 2) - uVar44), uVar24 = (ulong)pBVar38,
                     (ulong *)((long)puVar31 + (long)pBVar38) == iEnd)) break;
                }
              }
              else {
                puVar25 = (ulong *)(pBVar26 + uVar43);
                if (*(BYTE *)(uVar24 + (long)puVar25) == *(BYTE *)((long)puVar31 + uVar24)) {
                  puVar39 = puVar31;
                  if (puVar31 < puVar1) {
                    if (*puVar25 == *puVar31) {
                      lVar32 = 0;
                      do {
                        puVar39 = (ulong *)(local_180 + lVar32);
                        if (puVar1 <= puVar39) {
                          puVar25 = (ulong *)(pBVar26 + lVar32 + uVar43 + 8);
                          goto LAB_001fffd2;
                        }
                        lVar15 = lVar32 + uVar43 + 8;
                        lVar32 = lVar32 + 8;
                      } while (*(ulong *)(pBVar26 + lVar15) == *puVar39);
                      uVar40 = *puVar39 ^ *(ulong *)(pBVar26 + lVar15);
                      uVar43 = 0;
                      if (uVar40 != 0) {
                        for (; (uVar40 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                        }
                      }
                      pBVar38 = (BYTE *)((uVar43 >> 3 & 0x1fffffff) + lVar32);
                    }
                    else {
                      uVar40 = *puVar31 ^ *puVar25;
                      uVar43 = 0;
                      if (uVar40 != 0) {
                        for (; (uVar40 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                        }
                      }
                      pBVar38 = (BYTE *)(uVar43 >> 3 & 0x1fffffff);
                    }
                  }
                  else {
LAB_001fffd2:
                    if ((puVar39 < puVar2) && ((int)*puVar25 == (int)*puVar39)) {
                      puVar39 = (ulong *)((long)puVar39 + 4);
                      puVar25 = (ulong *)((long)puVar25 + 4);
                    }
                    if ((puVar39 < puVar3) && ((short)*puVar25 == (short)*puVar39)) {
                      puVar39 = (ulong *)((long)puVar39 + 2);
                      puVar25 = (ulong *)((long)puVar25 + 2);
                    }
                    if (puVar39 < iEnd) {
                      puVar39 = (ulong *)((long)puVar39 + (ulong)((BYTE)*puVar25 == (BYTE)*puVar39))
                      ;
                    }
                    pBVar38 = (BYTE *)((long)puVar39 - (long)puVar31);
                  }
                  goto LAB_00200018;
                }
              }
              pBVar38 = (BYTE *)uVar24;
              lVar47 = lVar47 + 1;
              uVar24 = (ulong)pBVar38;
            } while (lVar47 != lVar41);
          }
          if (pBVar38 < 4) break;
          uVar30 = (int)uVar42 + 1;
          uVar44 = 0x1f;
          if (uVar30 != 0) {
            for (; uVar30 >> uVar44 == 0; uVar44 = uVar44 - 1) {
            }
          }
          uVar30 = (int)local_1c8 + 1;
          iVar18 = 0x1f;
          if (uVar30 != 0) {
            for (; uVar30 >> iVar18 == 0; iVar18 = iVar18 + -1) {
            }
          }
          local_180 = local_180 + 1;
          puVar36 = puVar31;
        } while ((int)((uVar44 ^ 0x1f) + (int)uVar22 * 4 + -0x1b) < (int)pBVar38 * 4 - iVar18);
        if (uVar42 == 0) {
          UVar48 = 1;
          uVar44 = uVar46;
        }
        else {
          pBVar34 = (BYTE *)((long)puVar23 + (2 - (long)(base_00 + uVar42)));
          pBVar26 = iStart;
          pBVar38 = base_00;
          if ((uint)pBVar34 < uVar8) {
            pBVar26 = pBVar10 + uVar9;
            pBVar38 = pBVar10;
          }
          if ((local_140 < puVar23) &&
             (uVar24 = (ulong)pBVar34 & 0xffffffff, pBVar26 < pBVar38 + uVar24)) {
            pBVar38 = pBVar38 + uVar24;
            do {
              pBVar38 = pBVar38 + -1;
              puVar36 = (ulong *)((long)puVar23 + -1);
              if ((*(BYTE *)puVar36 != *pBVar38) ||
                 (uVar22 = uVar22 + 1, puVar23 = puVar36, puVar36 <= local_140)) break;
            } while (pBVar26 < pBVar38);
          }
          UVar48 = (int)uVar42 + 1;
          uVar44 = (int)uVar42 - 2;
          local_174 = uVar46;
        }
        uVar42 = (long)puVar23 - (long)local_140;
        puVar36 = (ulong *)seqStore->lit;
        if (puVar4 < puVar23) {
          puVar31 = puVar36;
          puVar25 = local_140;
          if (local_140 <= puVar4) {
            puVar31 = (ulong *)((long)puVar36 + ((long)puVar4 - (long)local_140));
            uVar24 = local_140[1];
            *puVar36 = *local_140;
            puVar36[1] = uVar24;
            puVar25 = puVar4;
            if (0x10 < (long)puVar4 - (long)local_140) {
              lVar41 = 0x10;
              do {
                uVar14 = *(undefined8 *)((BYTE *)((long)local_140 + lVar41) + 8);
                puVar5 = (undefined8 *)((long)puVar36 + lVar41);
                *puVar5 = *(undefined8 *)((long)local_140 + lVar41);
                puVar5[1] = uVar14;
                pBVar38 = (BYTE *)((long)local_140 + lVar41 + 0x10);
                uVar14 = *(undefined8 *)(pBVar38 + 8);
                puVar5[2] = *(undefined8 *)pBVar38;
                puVar5[3] = uVar14;
                lVar41 = lVar41 + 0x20;
              } while (puVar5 + 4 < puVar31);
            }
          }
          if (puVar25 < puVar23) {
            lVar41 = 0;
            do {
              *(BYTE *)((long)puVar31 + lVar41) = *(BYTE *)((long)puVar25 + lVar41);
              lVar41 = lVar41 + 1;
            } while ((long)puVar23 - (long)puVar25 != lVar41);
          }
LAB_00200466:
          seqStore->lit = seqStore->lit + uVar42;
          psVar37 = seqStore->sequences;
          if (0xffff < uVar42) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar37 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          uVar24 = local_140[1];
          *puVar36 = *local_140;
          puVar36[1] = uVar24;
          pBVar38 = seqStore->lit;
          if (0x10 < uVar42) {
            uVar24 = local_140[3];
            *(ulong *)(pBVar38 + 0x10) = local_140[2];
            *(ulong *)(pBVar38 + 0x18) = uVar24;
            if (0x20 < (long)uVar42) {
              lVar41 = 0;
              do {
                pBVar34 = (BYTE *)((long)local_140 + lVar41 + 0x20);
                uVar14 = *(undefined8 *)(pBVar34 + 8);
                pBVar26 = pBVar38 + lVar41 + 0x20;
                *(undefined8 *)pBVar26 = *(undefined8 *)pBVar34;
                *(undefined8 *)(pBVar26 + 8) = uVar14;
                pBVar34 = (BYTE *)((long)local_140 + lVar41 + 0x30);
                uVar14 = *(undefined8 *)(pBVar34 + 8);
                *(undefined8 *)(pBVar26 + 0x10) = *(undefined8 *)pBVar34;
                *(undefined8 *)(pBVar26 + 0x18) = uVar14;
                lVar41 = lVar41 + 0x20;
              } while (pBVar26 + 0x20 < pBVar38 + uVar42);
            }
            goto LAB_00200466;
          }
          seqStore->lit = pBVar38 + uVar42;
          psVar37 = seqStore->sequences;
        }
        psVar37->litLength = (U16)uVar42;
        psVar37->offset = UVar48;
        if (0xffff < uVar22 - 3) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar37 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar37->matchLength = (U16)(uVar22 - 3);
        psVar37 = psVar37 + 1;
        seqStore->sequences = psVar37;
        for (puVar36 = (ulong *)((long)puVar23 + uVar22); uVar46 = uVar44, local_140 = puVar36,
            puVar36 <= iLimit; puVar36 = (ulong *)((long)puVar36 + sVar21 + 4)) {
          iVar18 = (int)puVar36 - (int)base_00;
          UVar48 = (ms->window).lowLimit;
          UVar29 = iVar18 - uVar16;
          if (iVar18 - UVar48 <= uVar16) {
            UVar29 = UVar48;
          }
          if (ms->loadedDictEnd != 0) {
            UVar29 = UVar48;
          }
          uVar44 = iVar18 - local_174;
          pBVar38 = base_00;
          if (uVar44 < uVar8) {
            pBVar38 = pBVar10;
          }
          if (((iVar17 - uVar44 < 3) || (iVar18 - UVar29 <= local_174)) ||
             ((int)*puVar36 != *(int *)(pBVar38 + uVar44))) break;
          puVar31 = iEnd;
          if (uVar44 < uVar8) {
            puVar31 = puVar20;
          }
          sVar21 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar36 + 4),(BYTE *)((long)(pBVar38 + uVar44) + 4),
                              (BYTE *)iEnd,(BYTE *)puVar31,iStart);
          if (puVar36 <= puVar4) {
            puVar31 = (ulong *)seqStore->lit;
            uVar22 = puVar36[1];
            *puVar31 = *puVar36;
            puVar31[1] = uVar22;
            psVar37 = seqStore->sequences;
          }
          psVar37->litLength = 0;
          psVar37->offset = 1;
          if (0xffff < sVar21 + 1) {
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar37 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar37->matchLength = (U16)(sVar21 + 1);
          psVar37 = psVar37 + 1;
          seqStore->sequences = psVar37;
          uVar44 = local_174;
          local_174 = uVar46;
        }
      }
    } while (puVar36 < iLimit);
  }
  *rep = uVar46;
  rep[1] = local_174;
  return (long)iEnd - (long)local_140;
}

Assistant:

size_t ZSTD_compressBlock_lazy_extDict_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 1);
}